

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  RTCRayQueryContext *pRVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  uint uVar63;
  uint uVar64;
  undefined1 (*pauVar65) [32];
  ulong uVar66;
  uint uVar67;
  long lVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  int iVar72;
  float fVar73;
  float fVar100;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar104;
  undefined1 auVar87 [32];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar77 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar83 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar109;
  float fVar131;
  float fVar132;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar133;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar138 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar172;
  float fVar173;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar180;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [28];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar203;
  float fVar222;
  float fVar224;
  vint4 ai_2;
  undefined1 auVar205 [16];
  float fVar226;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar204;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar246;
  float fVar250;
  undefined1 auVar235 [16];
  float fVar247;
  float fVar251;
  float fVar255;
  undefined1 auVar238 [32];
  float fVar248;
  float fVar252;
  float fVar256;
  float fVar259;
  float fVar262;
  float fVar265;
  undefined1 auVar239 [32];
  float fVar249;
  float fVar253;
  float fVar257;
  float fVar260;
  float fVar263;
  float fVar266;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar254;
  float fVar258;
  float fVar261;
  float fVar264;
  undefined1 auVar245 [64];
  float fVar267;
  float fVar275;
  float fVar276;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar280;
  float fVar282;
  float fVar284;
  undefined1 auVar271 [32];
  float fVar278;
  undefined1 auVar272 [32];
  float fVar277;
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar285;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar286;
  float fVar297;
  float fVar298;
  vint4 ai_1;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar299;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar304;
  float fVar305;
  undefined1 auVar301 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar302 [32];
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar303 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar317;
  float fVar326;
  undefined1 auVar318 [32];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar319 [64];
  float fVar327;
  float fVar331;
  float fVar332;
  undefined1 auVar328 [16];
  float fVar333;
  float fVar337;
  undefined1 auVar329 [32];
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar330 [64];
  float fVar338;
  float fVar347;
  float fVar348;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar353;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar349;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar346 [64];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined1 local_c80 [32];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 (*local_9f8) [16];
  undefined1 (*local_9f0) [16];
  uint *local_9e8;
  undefined1 local_9e0 [8];
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  ulong local_900;
  undefined1 auStack_8f8 [24];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  Primitive *local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  RTCHitN local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar70 = (ulong)(byte)PVar3;
  auVar112 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar112 = vinsertps_avx(auVar112,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar203 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar112 = vsubps_avx(auVar112,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar134._0_4_ = fVar203 * auVar112._0_4_;
  auVar134._4_4_ = fVar203 * auVar112._4_4_;
  auVar134._8_4_ = fVar203 * auVar112._8_4_;
  auVar134._12_4_ = fVar203 * auVar112._12_4_;
  auVar268._0_4_ = fVar203 * auVar9._0_4_;
  auVar268._4_4_ = fVar203 * auVar9._4_4_;
  auVar268._8_4_ = fVar203 * auVar9._8_4_;
  auVar268._12_4_ = fVar203 * auVar9._12_4_;
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar70 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  uVar71 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar70 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar71 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar74 = vshufps_avx(auVar268,auVar268,0);
  auVar110 = vshufps_avx(auVar268,auVar268,0x55);
  auVar135 = vshufps_avx(auVar268,auVar268,0xaa);
  fVar203 = auVar135._0_4_;
  fVar152 = auVar135._4_4_;
  fVar222 = auVar135._8_4_;
  fVar172 = auVar135._12_4_;
  fVar231 = auVar110._0_4_;
  fVar246 = auVar110._4_4_;
  fVar250 = auVar110._8_4_;
  fVar254 = auVar110._12_4_;
  fVar224 = auVar74._0_4_;
  fVar173 = auVar74._4_4_;
  fVar226 = auVar74._8_4_;
  fVar174 = auVar74._12_4_;
  auVar328._0_4_ = fVar224 * auVar112._0_4_ + fVar231 * auVar9._0_4_ + fVar203 * auVar16._0_4_;
  auVar328._4_4_ = fVar173 * auVar112._4_4_ + fVar246 * auVar9._4_4_ + fVar152 * auVar16._4_4_;
  auVar328._8_4_ = fVar226 * auVar112._8_4_ + fVar250 * auVar9._8_4_ + fVar222 * auVar16._8_4_;
  auVar328._12_4_ = fVar174 * auVar112._12_4_ + fVar254 * auVar9._12_4_ + fVar172 * auVar16._12_4_;
  auVar339._0_4_ = fVar224 * auVar17._0_4_ + fVar231 * auVar208._0_4_ + auVar165._0_4_ * fVar203;
  auVar339._4_4_ = fVar173 * auVar17._4_4_ + fVar246 * auVar208._4_4_ + auVar165._4_4_ * fVar152;
  auVar339._8_4_ = fVar226 * auVar17._8_4_ + fVar250 * auVar208._8_4_ + auVar165._8_4_ * fVar222;
  auVar339._12_4_ = fVar174 * auVar17._12_4_ + fVar254 * auVar208._12_4_ + auVar165._12_4_ * fVar172
  ;
  auVar269._0_4_ = fVar224 * auVar75._0_4_ + fVar231 * auVar81._0_4_ + auVar111._0_4_ * fVar203;
  auVar269._4_4_ = fVar173 * auVar75._4_4_ + fVar246 * auVar81._4_4_ + auVar111._4_4_ * fVar152;
  auVar269._8_4_ = fVar226 * auVar75._8_4_ + fVar250 * auVar81._8_4_ + auVar111._8_4_ * fVar222;
  auVar269._12_4_ = fVar174 * auVar75._12_4_ + fVar254 * auVar81._12_4_ + auVar111._12_4_ * fVar172;
  auVar74 = vshufps_avx(auVar134,auVar134,0);
  auVar110 = vshufps_avx(auVar134,auVar134,0x55);
  auVar135 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar203 = auVar135._0_4_;
  fVar152 = auVar135._4_4_;
  fVar222 = auVar135._8_4_;
  fVar172 = auVar135._12_4_;
  fVar231 = auVar110._0_4_;
  fVar246 = auVar110._4_4_;
  fVar250 = auVar110._8_4_;
  fVar254 = auVar110._12_4_;
  fVar224 = auVar74._0_4_;
  fVar173 = auVar74._4_4_;
  fVar226 = auVar74._8_4_;
  fVar174 = auVar74._12_4_;
  auVar181._0_4_ = fVar224 * auVar112._0_4_ + fVar231 * auVar9._0_4_ + fVar203 * auVar16._0_4_;
  auVar181._4_4_ = fVar173 * auVar112._4_4_ + fVar246 * auVar9._4_4_ + fVar152 * auVar16._4_4_;
  auVar181._8_4_ = fVar226 * auVar112._8_4_ + fVar250 * auVar9._8_4_ + fVar222 * auVar16._8_4_;
  auVar181._12_4_ = fVar174 * auVar112._12_4_ + fVar254 * auVar9._12_4_ + fVar172 * auVar16._12_4_;
  auVar110._0_4_ = fVar224 * auVar17._0_4_ + auVar165._0_4_ * fVar203 + fVar231 * auVar208._0_4_;
  auVar110._4_4_ = fVar173 * auVar17._4_4_ + auVar165._4_4_ * fVar152 + fVar246 * auVar208._4_4_;
  auVar110._8_4_ = fVar226 * auVar17._8_4_ + auVar165._8_4_ * fVar222 + fVar250 * auVar208._8_4_;
  auVar110._12_4_ = fVar174 * auVar17._12_4_ + auVar165._12_4_ * fVar172 + fVar254 * auVar208._12_4_
  ;
  auVar74._0_4_ = fVar224 * auVar75._0_4_ + fVar231 * auVar81._0_4_ + auVar111._0_4_ * fVar203;
  auVar74._4_4_ = fVar173 * auVar75._4_4_ + fVar246 * auVar81._4_4_ + auVar111._4_4_ * fVar152;
  auVar74._8_4_ = fVar226 * auVar75._8_4_ + fVar250 * auVar81._8_4_ + auVar111._8_4_ * fVar222;
  auVar74._12_4_ = fVar174 * auVar75._12_4_ + fVar254 * auVar81._12_4_ + auVar111._12_4_ * fVar172;
  auVar235._8_4_ = 0x7fffffff;
  auVar235._0_8_ = 0x7fffffff7fffffff;
  auVar235._12_4_ = 0x7fffffff;
  auVar112 = vandps_avx(auVar328,auVar235);
  auVar153._8_4_ = 0x219392ef;
  auVar153._0_8_ = 0x219392ef219392ef;
  auVar153._12_4_ = 0x219392ef;
  auVar112 = vcmpps_avx(auVar112,auVar153,1);
  auVar9 = vblendvps_avx(auVar328,auVar153,auVar112);
  auVar112 = vandps_avx(auVar339,auVar235);
  auVar112 = vcmpps_avx(auVar112,auVar153,1);
  auVar16 = vblendvps_avx(auVar339,auVar153,auVar112);
  auVar112 = vandps_avx(auVar269,auVar235);
  auVar112 = vcmpps_avx(auVar112,auVar153,1);
  auVar112 = vblendvps_avx(auVar269,auVar153,auVar112);
  auVar17 = vrcpps_avx(auVar9);
  fVar231 = auVar17._0_4_;
  auVar135._0_4_ = fVar231 * auVar9._0_4_;
  fVar246 = auVar17._4_4_;
  auVar135._4_4_ = fVar246 * auVar9._4_4_;
  fVar250 = auVar17._8_4_;
  auVar135._8_4_ = fVar250 * auVar9._8_4_;
  fVar254 = auVar17._12_4_;
  auVar135._12_4_ = fVar254 * auVar9._12_4_;
  auVar270._8_4_ = 0x3f800000;
  auVar270._0_8_ = 0x3f8000003f800000;
  auVar270._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar270,auVar135);
  fVar231 = fVar231 + fVar231 * auVar9._0_4_;
  fVar246 = fVar246 + fVar246 * auVar9._4_4_;
  fVar250 = fVar250 + fVar250 * auVar9._8_4_;
  fVar254 = fVar254 + fVar254 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar16);
  fVar203 = auVar9._0_4_;
  auVar205._0_4_ = fVar203 * auVar16._0_4_;
  fVar222 = auVar9._4_4_;
  auVar205._4_4_ = fVar222 * auVar16._4_4_;
  fVar224 = auVar9._8_4_;
  auVar205._8_4_ = fVar224 * auVar16._8_4_;
  fVar226 = auVar9._12_4_;
  auVar205._12_4_ = fVar226 * auVar16._12_4_;
  auVar9 = vsubps_avx(auVar270,auVar205);
  fVar203 = fVar203 + fVar203 * auVar9._0_4_;
  fVar222 = fVar222 + fVar222 * auVar9._4_4_;
  fVar224 = fVar224 + fVar224 * auVar9._8_4_;
  fVar226 = fVar226 + fVar226 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar112);
  fVar152 = auVar9._0_4_;
  auVar154._0_4_ = fVar152 * auVar112._0_4_;
  fVar172 = auVar9._4_4_;
  auVar154._4_4_ = fVar172 * auVar112._4_4_;
  fVar173 = auVar9._8_4_;
  auVar154._8_4_ = fVar173 * auVar112._8_4_;
  fVar174 = auVar9._12_4_;
  auVar154._12_4_ = fVar174 * auVar112._12_4_;
  auVar112 = vsubps_avx(auVar270,auVar154);
  fVar152 = fVar152 + fVar152 * auVar112._0_4_;
  fVar172 = fVar172 + fVar172 * auVar112._4_4_;
  fVar173 = fVar173 + fVar173 * auVar112._8_4_;
  fVar174 = fVar174 + fVar174 * auVar112._12_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar112 = vpmovsxwd_avx(auVar112);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar181);
  auVar83._0_4_ = fVar231 * auVar112._0_4_;
  auVar83._4_4_ = fVar246 * auVar112._4_4_;
  auVar83._8_4_ = fVar250 * auVar112._8_4_;
  auVar83._12_4_ = fVar254 * auVar112._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar112 = vpmovsxwd_avx(auVar9);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar181);
  auVar182._0_4_ = fVar231 * auVar112._0_4_;
  auVar182._4_4_ = fVar246 * auVar112._4_4_;
  auVar182._8_4_ = fVar250 * auVar112._8_4_;
  auVar182._12_4_ = fVar254 * auVar112._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar70 * -2 + 6);
  auVar112 = vpmovsxwd_avx(auVar17);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar110);
  auVar287._0_4_ = auVar112._0_4_ * fVar203;
  auVar287._4_4_ = auVar112._4_4_ * fVar222;
  auVar287._8_4_ = auVar112._8_4_ * fVar224;
  auVar287._12_4_ = auVar112._12_4_ * fVar226;
  auVar112 = vcvtdq2ps_avx(auVar9);
  auVar112 = vsubps_avx(auVar112,auVar110);
  auVar111._0_4_ = fVar203 * auVar112._0_4_;
  auVar111._4_4_ = fVar222 * auVar112._4_4_;
  auVar111._8_4_ = fVar224 * auVar112._8_4_;
  auVar111._12_4_ = fVar226 * auVar112._12_4_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar71 + uVar70 + 6);
  auVar112 = vpmovsxwd_avx(auVar208);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar74);
  auVar206._0_4_ = auVar112._0_4_ * fVar152;
  auVar206._4_4_ = auVar112._4_4_ * fVar172;
  auVar206._8_4_ = auVar112._8_4_ * fVar173;
  auVar206._12_4_ = auVar112._12_4_ * fVar174;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar112 = vpmovsxwd_avx(auVar165);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar74);
  auVar75._0_4_ = auVar112._0_4_ * fVar152;
  auVar75._4_4_ = auVar112._4_4_ * fVar172;
  auVar75._8_4_ = auVar112._8_4_ * fVar173;
  auVar75._12_4_ = auVar112._12_4_ * fVar174;
  auVar112 = vpminsd_avx(auVar83,auVar182);
  auVar9 = vpminsd_avx(auVar287,auVar111);
  auVar112 = vmaxps_avx(auVar112,auVar9);
  auVar9 = vpminsd_avx(auVar206,auVar75);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar301._4_4_ = uVar1;
  auVar301._0_4_ = uVar1;
  auVar301._8_4_ = uVar1;
  auVar301._12_4_ = uVar1;
  auVar9 = vmaxps_avx(auVar9,auVar301);
  auVar112 = vmaxps_avx(auVar112,auVar9);
  local_5e0._0_4_ = auVar112._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar112._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar112._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar112._12_4_ * 0.99999964;
  auVar112 = vpmaxsd_avx(auVar83,auVar182);
  auVar9 = vpmaxsd_avx(auVar287,auVar111);
  auVar112 = vminps_avx(auVar112,auVar9);
  auVar9 = vpmaxsd_avx(auVar206,auVar75);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar136._4_4_ = uVar1;
  auVar136._0_4_ = uVar1;
  auVar136._8_4_ = uVar1;
  auVar136._12_4_ = uVar1;
  auVar9 = vminps_avx(auVar9,auVar136);
  auVar112 = vminps_avx(auVar112,auVar9);
  auVar81._0_4_ = auVar112._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar112._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar112._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar112._12_4_ * 1.0000004;
  auVar112 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar9 = vpcmpgtd_avx(auVar112,_DAT_01f7fcf0);
  auVar112 = vcmpps_avx(local_5e0,auVar81,2);
  auVar112 = vandps_avx(auVar112,auVar9);
  uVar63 = vmovmskps_avx(auVar112);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  uVar69 = 1 << ((byte)k & 0x1f);
  local_9e8 = &local_4e0;
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar69 & 0xf) << 4));
  local_9f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar69 >> 4) * 0x10);
  local_888 = prim;
LAB_00ea8798:
  uVar71 = (ulong)uVar63;
  lVar68 = 0;
  if (uVar71 != 0) {
    for (; (uVar63 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar71 = uVar71 - 1 & uVar71;
  uVar63 = *(uint *)(local_888 + 2);
  local_900 = (ulong)*(uint *)(local_888 + lVar68 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar63].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_900);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar112 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar70);
  auVar9 = *(undefined1 (*) [16])(lVar6 + (uVar70 + 1) * (long)p_Var5);
  auVar16 = *(undefined1 (*) [16])(lVar6 + (uVar70 + 2) * (long)p_Var5);
  lVar8 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar17 = *(undefined1 (*) [16])(lVar6 + (uVar70 + 3) * (long)p_Var5);
  if (((uVar71 != 0) && (uVar70 = uVar71 - 1 & uVar71, uVar70 != 0)) && (lVar6 = 0, uVar70 != 0)) {
    for (; (uVar70 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar208 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar165 = vinsertps_avx(auVar208,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar203 = *(float *)(ray + k * 4 + 0x80);
  auVar313._4_4_ = fVar203;
  auVar313._0_4_ = fVar203;
  auVar313._8_4_ = fVar203;
  auVar313._12_4_ = fVar203;
  fStack_7f0 = fVar203;
  _local_800 = auVar313;
  fStack_7ec = fVar203;
  fStack_7e8 = fVar203;
  fStack_7e4 = fVar203;
  fVar152 = *(float *)(ray + k * 4 + 0xa0);
  auVar340._4_4_ = fVar152;
  auVar340._0_4_ = fVar152;
  auVar340._8_4_ = fVar152;
  auVar340._12_4_ = fVar152;
  fStack_810 = fVar152;
  _local_820 = auVar340;
  fStack_80c = fVar152;
  fStack_808 = fVar152;
  fStack_804 = fVar152;
  auVar208 = vunpcklps_avx(auVar313,auVar340);
  fVar222 = *(float *)(ray + k * 4 + 0xc0);
  auVar361._4_4_ = fVar222;
  auVar361._0_4_ = fVar222;
  auVar361._8_4_ = fVar222;
  auVar361._12_4_ = fVar222;
  fStack_790 = fVar222;
  _local_7a0 = auVar361;
  fStack_78c = fVar222;
  fStack_788 = fVar222;
  fStack_784 = fVar222;
  _local_930 = vinsertps_avx(auVar208,auVar361,0x28);
  auVar76._0_4_ = (auVar112._0_4_ + auVar9._0_4_ + auVar16._0_4_ + auVar17._0_4_) * 0.25;
  auVar76._4_4_ = (auVar112._4_4_ + auVar9._4_4_ + auVar16._4_4_ + auVar17._4_4_) * 0.25;
  auVar76._8_4_ = (auVar112._8_4_ + auVar9._8_4_ + auVar16._8_4_ + auVar17._8_4_) * 0.25;
  auVar76._12_4_ = (auVar112._12_4_ + auVar9._12_4_ + auVar16._12_4_ + auVar17._12_4_) * 0.25;
  auVar208 = vsubps_avx(auVar76,auVar165);
  auVar208 = vdpps_avx(auVar208,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar75 = vrcpss_avx(local_940,local_940);
  fVar172 = auVar208._0_4_ * auVar75._0_4_ * (2.0 - local_940._0_4_ * auVar75._0_4_);
  auVar75 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
  auVar207._0_4_ = auVar165._0_4_ + local_930._0_4_ * auVar75._0_4_;
  auVar207._4_4_ = auVar165._4_4_ + local_930._4_4_ * auVar75._4_4_;
  auVar207._8_4_ = auVar165._8_4_ + local_930._8_4_ * auVar75._8_4_;
  auVar207._12_4_ = auVar165._12_4_ + local_930._12_4_ * auVar75._12_4_;
  auVar208 = vblendps_avx(auVar207,_DAT_01f7aa10,8);
  _local_b00 = vsubps_avx(auVar112,auVar208);
  _local_b10 = vsubps_avx(auVar16,auVar208);
  _local_b20 = vsubps_avx(auVar9,auVar208);
  _local_b30 = vsubps_avx(auVar17,auVar208);
  auVar9 = vshufps_avx(_local_b00,_local_b00,0);
  auVar112 = vshufps_avx(_local_b00,_local_b00,0x55);
  local_a20._16_16_ = auVar112;
  local_a20._0_16_ = auVar112;
  auVar319 = ZEXT3264(local_a20);
  auVar112 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_a40._16_16_ = auVar112;
  local_a40._0_16_ = auVar112;
  auVar330 = ZEXT3264(local_a40);
  auVar112 = vshufps_avx(_local_b00,_local_b00,0xff);
  local_a60._16_16_ = auVar112;
  local_a60._0_16_ = auVar112;
  auVar346 = ZEXT3264(local_a60);
  auVar112 = vshufps_avx(_local_b20,_local_b20,0);
  auVar213._16_16_ = auVar112;
  auVar213._0_16_ = auVar112;
  auVar16 = vshufps_avx(_local_b20,_local_b20,0x55);
  auVar112 = vshufps_avx(_local_b20,_local_b20,0xaa);
  local_aa0._16_16_ = auVar112;
  local_aa0._0_16_ = auVar112;
  auVar245 = ZEXT3264(local_aa0);
  auVar112 = vshufps_avx(_local_b20,_local_b20,0xff);
  local_840._16_16_ = auVar112;
  local_840._0_16_ = auVar112;
  auVar365 = ZEXT3264(local_840);
  auVar112 = vshufps_avx(_local_b10,_local_b10,0);
  local_2c0._16_16_ = auVar112;
  local_2c0._0_16_ = auVar112;
  auVar112 = vshufps_avx(_local_b10,_local_b10,0x55);
  local_2e0._16_16_ = auVar112;
  local_2e0._0_16_ = auVar112;
  auVar112 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar112;
  _local_1e0 = auVar112;
  auVar112 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar112;
  _local_200 = auVar112;
  auVar112 = vshufps_avx(_local_b30,_local_b30,0);
  register0x00001290 = auVar112;
  _local_220 = auVar112;
  auVar112 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar112;
  _local_240 = auVar112;
  auVar112 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar112;
  _local_260 = auVar112;
  auVar112 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar112;
  _local_280 = auVar112;
  auVar112 = ZEXT416((uint)(fVar203 * fVar203 + fVar152 * fVar152 + fVar222 * fVar222));
  auVar112 = vshufps_avx(auVar112,auVar112,0);
  local_2a0._16_16_ = auVar112;
  local_2a0._0_16_ = auVar112;
  fVar203 = *(float *)(ray + k * 4 + 0x60);
  local_8a0 = ZEXT416((uint)fVar172);
  auVar112 = vshufps_avx(ZEXT416((uint)(fVar203 - fVar172)),ZEXT416((uint)(fVar203 - fVar172)),0);
  local_300._16_16_ = auVar112;
  local_300._0_16_ = auVar112;
  auVar112 = vpshufd_avx(ZEXT416(uVar63),0);
  local_460._16_16_ = auVar112;
  local_460._0_16_ = auVar112;
  auVar112 = vpshufd_avx(ZEXT416(*(uint *)(local_888 + lVar68 * 4 + 6)),0);
  local_480._16_16_ = auVar112;
  local_480._0_16_ = auVar112;
  local_ca0 = auVar75._0_8_;
  uStack_c98 = auVar75._8_8_;
  local_8e0 = local_ca0;
  uStack_8d8 = uStack_c98;
  uStack_8d0 = local_ca0;
  uStack_8c8 = uStack_c98;
  local_ca8 = 1;
  uVar70 = 0;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2a0,auVar86);
  auVar112 = vsqrtss_avx(local_940,local_940);
  auVar17 = vsqrtss_avx(local_940,local_940);
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_420 = auVar213;
  do {
    auVar214._8_4_ = 0x3f800000;
    auVar214._0_8_ = 0x3f8000003f800000;
    auVar214._12_4_ = 0x3f800000;
    auVar214._16_4_ = 0x3f800000;
    auVar214._20_4_ = 0x3f800000;
    iVar72 = (int)uVar70;
    auVar214._24_4_ = 0x3f800000;
    auVar214._28_4_ = 0x3f800000;
    auVar208 = vmovshdup_avx(local_5d0);
    auVar75 = vsubps_avx(auVar208,local_5d0);
    auVar208 = vshufps_avx(local_5d0,local_5d0,0);
    local_760._16_16_ = auVar208;
    local_760._0_16_ = auVar208;
    auVar165 = vshufps_avx(auVar75,auVar75,0);
    local_780._16_16_ = auVar165;
    local_780._0_16_ = auVar165;
    fVar109 = auVar165._0_4_;
    fVar131 = auVar165._4_4_;
    fVar132 = auVar165._8_4_;
    fVar133 = auVar165._12_4_;
    fVar73 = auVar208._0_4_;
    auVar123._0_4_ = fVar73 + fVar109 * 0.0;
    fVar100 = auVar208._4_4_;
    auVar123._4_4_ = fVar100 + fVar131 * 0.14285715;
    fVar102 = auVar208._8_4_;
    auVar123._8_4_ = fVar102 + fVar132 * 0.2857143;
    fVar104 = auVar208._12_4_;
    auVar123._12_4_ = fVar104 + fVar133 * 0.42857146;
    auVar123._16_4_ = fVar73 + fVar109 * 0.5714286;
    auVar123._20_4_ = fVar100 + fVar131 * 0.71428573;
    auVar123._24_4_ = fVar102 + fVar132 * 0.8571429;
    auVar123._28_4_ = fVar104 + fVar133;
    auVar85 = vsubps_avx(auVar214,auVar123);
    fVar286 = auVar16._0_4_;
    fVar297 = auVar16._4_4_;
    fVar298 = auVar16._8_4_;
    fVar299 = auVar16._12_4_;
    fVar231 = auVar213._28_4_;
    fVar152 = auVar85._0_4_;
    fVar222 = auVar85._4_4_;
    fVar172 = auVar85._8_4_;
    fVar224 = auVar85._12_4_;
    fVar173 = auVar85._16_4_;
    fVar226 = auVar85._20_4_;
    fVar174 = auVar85._24_4_;
    fVar179 = auVar245._28_4_ + fVar231 + 1.0 + 1.0;
    fVar232 = local_2c0._0_4_ * auVar123._0_4_ + auVar213._0_4_ * fVar152;
    fVar247 = local_2c0._4_4_ * auVar123._4_4_ + auVar213._4_4_ * fVar222;
    fVar251 = local_2c0._8_4_ * auVar123._8_4_ + auVar213._8_4_ * fVar172;
    fVar255 = local_2c0._12_4_ * auVar123._12_4_ + auVar213._12_4_ * fVar224;
    fVar258 = local_2c0._16_4_ * auVar123._16_4_ + auVar213._16_4_ * fVar173;
    fVar261 = local_2c0._20_4_ * auVar123._20_4_ + auVar213._20_4_ * fVar226;
    fVar264 = local_2c0._24_4_ * auVar123._24_4_ + auVar213._24_4_ * fVar174;
    fVar246 = local_2e0._0_4_ * auVar123._0_4_ + fVar286 * fVar152;
    fVar250 = local_2e0._4_4_ * auVar123._4_4_ + fVar297 * fVar222;
    fVar254 = local_2e0._8_4_ * auVar123._8_4_ + fVar298 * fVar172;
    fVar175 = local_2e0._12_4_ * auVar123._12_4_ + fVar299 * fVar224;
    fVar176 = local_2e0._16_4_ * auVar123._16_4_ + fVar286 * fVar173;
    fVar177 = local_2e0._20_4_ * auVar123._20_4_ + fVar297 * fVar226;
    fVar178 = local_2e0._24_4_ * auVar123._24_4_ + fVar298 * fVar174;
    fVar180 = (float)local_1e0._0_4_ * auVar123._0_4_ + auVar245._0_4_ * fVar152;
    fVar197 = (float)local_1e0._4_4_ * auVar123._4_4_ + auVar245._4_4_ * fVar222;
    fVar198 = fStack_1d8 * auVar123._8_4_ + auVar245._8_4_ * fVar172;
    fVar199 = fStack_1d4 * auVar123._12_4_ + auVar245._12_4_ * fVar224;
    fVar200 = fStack_1d0 * auVar123._16_4_ + auVar245._16_4_ * fVar173;
    fVar201 = fStack_1cc * auVar123._20_4_ + auVar245._20_4_ * fVar226;
    fVar202 = fStack_1c8 * auVar123._24_4_ + auVar245._24_4_ * fVar174;
    fVar204 = (float)local_200._0_4_ * auVar123._0_4_ + auVar365._0_4_ * fVar152;
    fVar223 = (float)local_200._4_4_ * auVar123._4_4_ + auVar365._4_4_ * fVar222;
    fVar225 = fStack_1f8 * auVar123._8_4_ + auVar365._8_4_ * fVar172;
    fVar227 = fStack_1f4 * auVar123._12_4_ + auVar365._12_4_ * fVar224;
    fVar228 = fStack_1f0 * auVar123._16_4_ + auVar365._16_4_ * fVar173;
    fVar229 = fStack_1ec * auVar123._20_4_ + auVar365._20_4_ * fVar226;
    fVar230 = fStack_1e8 * auVar123._24_4_ + auVar365._24_4_ * fVar174;
    fVar326 = auVar319._28_4_;
    fVar353 = fVar326 + local_2c0._28_4_;
    fVar337 = auVar365._28_4_ + fVar326;
    auVar302._0_4_ =
         fVar152 * (auVar213._0_4_ * auVar123._0_4_ + auVar9._0_4_ * fVar152) +
         auVar123._0_4_ * fVar232;
    auVar302._4_4_ =
         fVar222 * (auVar213._4_4_ * auVar123._4_4_ + auVar9._4_4_ * fVar222) +
         auVar123._4_4_ * fVar247;
    auVar302._8_4_ =
         fVar172 * (auVar213._8_4_ * auVar123._8_4_ + auVar9._8_4_ * fVar172) +
         auVar123._8_4_ * fVar251;
    auVar302._12_4_ =
         fVar224 * (auVar213._12_4_ * auVar123._12_4_ + auVar9._12_4_ * fVar224) +
         auVar123._12_4_ * fVar255;
    auVar302._16_4_ =
         fVar173 * (auVar213._16_4_ * auVar123._16_4_ + auVar9._0_4_ * fVar173) +
         auVar123._16_4_ * fVar258;
    auVar302._20_4_ =
         fVar226 * (auVar213._20_4_ * auVar123._20_4_ + auVar9._4_4_ * fVar226) +
         auVar123._20_4_ * fVar261;
    auVar302._24_4_ =
         fVar174 * (auVar213._24_4_ * auVar123._24_4_ + auVar9._8_4_ * fVar174) +
         auVar123._24_4_ * fVar264;
    auVar302._28_4_ = fStack_1c4 + fVar326;
    auVar314._0_4_ =
         fVar152 * (fVar286 * auVar123._0_4_ + auVar319._0_4_ * fVar152) + auVar123._0_4_ * fVar246;
    auVar314._4_4_ =
         fVar222 * (fVar297 * auVar123._4_4_ + auVar319._4_4_ * fVar222) + auVar123._4_4_ * fVar250;
    auVar314._8_4_ =
         fVar172 * (fVar298 * auVar123._8_4_ + auVar319._8_4_ * fVar172) + auVar123._8_4_ * fVar254;
    auVar314._12_4_ =
         fVar224 * (fVar299 * auVar123._12_4_ + auVar319._12_4_ * fVar224) +
         auVar123._12_4_ * fVar175;
    auVar314._16_4_ =
         fVar173 * (fVar286 * auVar123._16_4_ + auVar319._16_4_ * fVar173) +
         auVar123._16_4_ * fVar176;
    auVar314._20_4_ =
         fVar226 * (fVar297 * auVar123._20_4_ + auVar319._20_4_ * fVar226) +
         auVar123._20_4_ * fVar177;
    auVar314._24_4_ =
         fVar174 * (fVar298 * auVar123._24_4_ + auVar319._24_4_ * fVar174) +
         auVar123._24_4_ * fVar178;
    auVar314._28_4_ = fStack_1e4 + fVar326;
    auVar318._0_4_ =
         fVar152 * (auVar245._0_4_ * auVar123._0_4_ + auVar330._0_4_ * fVar152) +
         auVar123._0_4_ * fVar180;
    auVar318._4_4_ =
         fVar222 * (auVar245._4_4_ * auVar123._4_4_ + auVar330._4_4_ * fVar222) +
         auVar123._4_4_ * fVar197;
    auVar318._8_4_ =
         fVar172 * (auVar245._8_4_ * auVar123._8_4_ + auVar330._8_4_ * fVar172) +
         auVar123._8_4_ * fVar198;
    auVar318._12_4_ =
         fVar224 * (auVar245._12_4_ * auVar123._12_4_ + auVar330._12_4_ * fVar224) +
         auVar123._12_4_ * fVar199;
    auVar318._16_4_ =
         fVar173 * (auVar245._16_4_ * auVar123._16_4_ + auVar330._16_4_ * fVar173) +
         auVar123._16_4_ * fVar200;
    auVar318._20_4_ =
         fVar226 * (auVar245._20_4_ * auVar123._20_4_ + auVar330._20_4_ * fVar226) +
         auVar123._20_4_ * fVar201;
    auVar318._24_4_ =
         fVar174 * (auVar245._24_4_ * auVar123._24_4_ + auVar330._24_4_ * fVar174) +
         auVar123._24_4_ * fVar202;
    auVar318._28_4_ = fVar299 + fVar326;
    auVar271._0_4_ =
         auVar123._0_4_ * fVar204 +
         fVar152 * (auVar365._0_4_ * auVar123._0_4_ + auVar346._0_4_ * fVar152);
    auVar271._4_4_ =
         auVar123._4_4_ * fVar223 +
         fVar222 * (auVar365._4_4_ * auVar123._4_4_ + auVar346._4_4_ * fVar222);
    auVar271._8_4_ =
         auVar123._8_4_ * fVar225 +
         fVar172 * (auVar365._8_4_ * auVar123._8_4_ + auVar346._8_4_ * fVar172);
    auVar271._12_4_ =
         auVar123._12_4_ * fVar227 +
         fVar224 * (auVar365._12_4_ * auVar123._12_4_ + auVar346._12_4_ * fVar224);
    auVar271._16_4_ =
         auVar123._16_4_ * fVar228 +
         fVar173 * (auVar365._16_4_ * auVar123._16_4_ + auVar346._16_4_ * fVar173);
    auVar271._20_4_ =
         auVar123._20_4_ * fVar229 +
         fVar226 * (auVar365._20_4_ * auVar123._20_4_ + auVar346._20_4_ * fVar226);
    auVar271._24_4_ =
         auVar123._24_4_ * fVar230 +
         fVar174 * (auVar365._24_4_ * auVar123._24_4_ + auVar346._24_4_ * fVar174);
    auVar271._28_4_ = fVar299 + auVar9._12_4_ + 1.0;
    auVar238._0_4_ =
         (auVar123._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar152) * auVar123._0_4_ +
         fVar152 * fVar232;
    auVar238._4_4_ =
         (auVar123._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar222) * auVar123._4_4_ +
         fVar222 * fVar247;
    auVar238._8_4_ =
         (auVar123._8_4_ * fStack_218 + local_2c0._8_4_ * fVar172) * auVar123._8_4_ +
         fVar172 * fVar251;
    auVar238._12_4_ =
         (auVar123._12_4_ * fStack_214 + local_2c0._12_4_ * fVar224) * auVar123._12_4_ +
         fVar224 * fVar255;
    auVar238._16_4_ =
         (auVar123._16_4_ * fStack_210 + local_2c0._16_4_ * fVar173) * auVar123._16_4_ +
         fVar173 * fVar258;
    auVar238._20_4_ =
         (auVar123._20_4_ * fStack_20c + local_2c0._20_4_ * fVar226) * auVar123._20_4_ +
         fVar226 * fVar261;
    auVar238._24_4_ =
         (auVar123._24_4_ * fStack_208 + local_2c0._24_4_ * fVar174) * auVar123._24_4_ +
         fVar174 * fVar264;
    auVar238._28_4_ = fVar299 + fVar179 + auVar245._28_4_;
    auVar168._0_4_ =
         (auVar123._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar152) * auVar123._0_4_ +
         fVar152 * fVar246;
    auVar168._4_4_ =
         (auVar123._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar222) * auVar123._4_4_ +
         fVar222 * fVar250;
    auVar168._8_4_ =
         (auVar123._8_4_ * fStack_238 + local_2e0._8_4_ * fVar172) * auVar123._8_4_ +
         fVar172 * fVar254;
    auVar168._12_4_ =
         (auVar123._12_4_ * fStack_234 + local_2e0._12_4_ * fVar224) * auVar123._12_4_ +
         fVar224 * fVar175;
    auVar168._16_4_ =
         (auVar123._16_4_ * fStack_230 + local_2e0._16_4_ * fVar173) * auVar123._16_4_ +
         fVar173 * fVar176;
    auVar168._20_4_ =
         (auVar123._20_4_ * fStack_22c + local_2e0._20_4_ * fVar226) * auVar123._20_4_ +
         fVar226 * fVar177;
    auVar168._24_4_ =
         (auVar123._24_4_ * fStack_228 + local_2e0._24_4_ * fVar174) * auVar123._24_4_ +
         fVar174 * fVar178;
    auVar168._28_4_ = fVar299 + fVar231 + fVar179;
    auVar192._0_4_ =
         (auVar123._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar152) *
         auVar123._0_4_ + fVar152 * fVar180;
    auVar192._4_4_ =
         (auVar123._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar222) *
         auVar123._4_4_ + fVar222 * fVar197;
    auVar192._8_4_ =
         (auVar123._8_4_ * fStack_258 + fStack_1d8 * fVar172) * auVar123._8_4_ + fVar172 * fVar198;
    auVar192._12_4_ =
         (auVar123._12_4_ * fStack_254 + fStack_1d4 * fVar224) * auVar123._12_4_ + fVar224 * fVar199
    ;
    auVar192._16_4_ =
         (auVar123._16_4_ * fStack_250 + fStack_1d0 * fVar173) * auVar123._16_4_ + fVar173 * fVar200
    ;
    auVar192._20_4_ =
         (auVar123._20_4_ * fStack_24c + fStack_1cc * fVar226) * auVar123._20_4_ + fVar226 * fVar201
    ;
    auVar192._24_4_ =
         (auVar123._24_4_ * fStack_248 + fStack_1c8 * fVar174) * auVar123._24_4_ + fVar174 * fVar202
    ;
    auVar192._28_4_ = fVar337 + fVar231 + 1.0;
    auVar215._0_4_ =
         (auVar123._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar152) *
         auVar123._0_4_ + fVar152 * fVar204;
    auVar215._4_4_ =
         (auVar123._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar222) *
         auVar123._4_4_ + fVar222 * fVar223;
    auVar215._8_4_ =
         (auVar123._8_4_ * fStack_278 + fStack_1f8 * fVar172) * auVar123._8_4_ + fVar172 * fVar225;
    auVar215._12_4_ =
         (auVar123._12_4_ * fStack_274 + fStack_1f4 * fVar224) * auVar123._12_4_ + fVar224 * fVar227
    ;
    auVar215._16_4_ =
         (auVar123._16_4_ * fStack_270 + fStack_1f0 * fVar173) * auVar123._16_4_ + fVar173 * fVar228
    ;
    auVar215._20_4_ =
         (auVar123._20_4_ * fStack_26c + fStack_1ec * fVar226) * auVar123._20_4_ + fVar226 * fVar229
    ;
    auVar215._24_4_ =
         (auVar123._24_4_ * fStack_268 + fStack_1e8 * fVar174) * auVar123._24_4_ + fVar174 * fVar230
    ;
    auVar215._28_4_ = fVar353 + fVar326 + 1.0;
    auVar341._0_4_ = auVar302._0_4_ * fVar152 + auVar123._0_4_ * auVar238._0_4_;
    auVar341._4_4_ = auVar302._4_4_ * fVar222 + auVar123._4_4_ * auVar238._4_4_;
    auVar341._8_4_ = auVar302._8_4_ * fVar172 + auVar123._8_4_ * auVar238._8_4_;
    auVar341._12_4_ = auVar302._12_4_ * fVar224 + auVar123._12_4_ * auVar238._12_4_;
    auVar341._16_4_ = auVar302._16_4_ * fVar173 + auVar123._16_4_ * auVar238._16_4_;
    auVar341._20_4_ = auVar302._20_4_ * fVar226 + auVar123._20_4_ * auVar238._20_4_;
    auVar341._24_4_ = auVar302._24_4_ * fVar174 + auVar123._24_4_ * auVar238._24_4_;
    auVar341._28_4_ = fVar353 + fVar299;
    auVar354._0_4_ = auVar314._0_4_ * fVar152 + auVar123._0_4_ * auVar168._0_4_;
    auVar354._4_4_ = auVar314._4_4_ * fVar222 + auVar123._4_4_ * auVar168._4_4_;
    auVar354._8_4_ = auVar314._8_4_ * fVar172 + auVar123._8_4_ * auVar168._8_4_;
    auVar354._12_4_ = auVar314._12_4_ * fVar224 + auVar123._12_4_ * auVar168._12_4_;
    auVar354._16_4_ = auVar314._16_4_ * fVar173 + auVar123._16_4_ * auVar168._16_4_;
    auVar354._20_4_ = auVar314._20_4_ * fVar226 + auVar123._20_4_ * auVar168._20_4_;
    auVar354._24_4_ = auVar314._24_4_ * fVar174 + auVar123._24_4_ * auVar168._24_4_;
    auVar354._28_4_ = fVar299 + fVar337;
    auVar362._0_4_ = auVar318._0_4_ * fVar152 + auVar123._0_4_ * auVar192._0_4_;
    auVar362._4_4_ = auVar318._4_4_ * fVar222 + auVar123._4_4_ * auVar192._4_4_;
    auVar362._8_4_ = auVar318._8_4_ * fVar172 + auVar123._8_4_ * auVar192._8_4_;
    auVar362._12_4_ = auVar318._12_4_ * fVar224 + auVar123._12_4_ * auVar192._12_4_;
    auVar362._16_4_ = auVar318._16_4_ * fVar173 + auVar123._16_4_ * auVar192._16_4_;
    auVar362._20_4_ = auVar318._20_4_ * fVar226 + auVar123._20_4_ * auVar192._20_4_;
    auVar362._24_4_ = auVar318._24_4_ * fVar174 + auVar123._24_4_ * auVar192._24_4_;
    auVar362._28_4_ = fVar337 + fVar299;
    local_c80._0_4_ = auVar75._0_4_;
    auVar290._0_4_ = fVar152 * auVar271._0_4_ + auVar123._0_4_ * auVar215._0_4_;
    auVar290._4_4_ = fVar222 * auVar271._4_4_ + auVar123._4_4_ * auVar215._4_4_;
    auVar290._8_4_ = fVar172 * auVar271._8_4_ + auVar123._8_4_ * auVar215._8_4_;
    auVar290._12_4_ = fVar224 * auVar271._12_4_ + auVar123._12_4_ * auVar215._12_4_;
    auVar290._16_4_ = fVar173 * auVar271._16_4_ + auVar123._16_4_ * auVar215._16_4_;
    auVar290._20_4_ = fVar226 * auVar271._20_4_ + auVar123._20_4_ * auVar215._20_4_;
    auVar290._24_4_ = fVar174 * auVar271._24_4_ + auVar123._24_4_ * auVar215._24_4_;
    auVar290._28_4_ = auVar85._28_4_ + auVar123._28_4_;
    auVar85 = vsubps_avx(auVar238,auVar302);
    auVar213 = vsubps_avx(auVar168,auVar314);
    auVar86 = vsubps_avx(auVar192,auVar318);
    auVar123 = vsubps_avx(auVar215,auVar271);
    auVar208 = vshufps_avx(ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),0);
    fVar226 = auVar208._0_4_;
    fVar233 = fVar226 * auVar85._0_4_ * 3.0;
    fVar231 = auVar208._4_4_;
    fVar248 = fVar231 * auVar85._4_4_ * 3.0;
    auVar359._4_4_ = fVar248;
    auVar359._0_4_ = fVar233;
    fVar177 = auVar208._8_4_;
    fVar252 = fVar177 * auVar85._8_4_ * 3.0;
    auVar359._8_4_ = fVar252;
    fVar199 = auVar208._12_4_;
    fVar256 = fVar199 * auVar85._12_4_ * 3.0;
    auVar359._12_4_ = fVar256;
    fVar259 = fVar226 * auVar85._16_4_ * 3.0;
    auVar359._16_4_ = fVar259;
    fVar262 = fVar231 * auVar85._20_4_ * 3.0;
    auVar359._20_4_ = fVar262;
    fVar265 = fVar177 * auVar85._24_4_ * 3.0;
    auVar359._24_4_ = fVar265;
    auVar359._28_4_ = auVar238._28_4_;
    fVar267 = fVar226 * auVar213._0_4_ * 3.0;
    fVar275 = fVar231 * auVar213._4_4_ * 3.0;
    auVar25._4_4_ = fVar275;
    auVar25._0_4_ = fVar267;
    fVar276 = fVar177 * auVar213._8_4_ * 3.0;
    auVar25._8_4_ = fVar276;
    fVar278 = fVar199 * auVar213._12_4_ * 3.0;
    auVar25._12_4_ = fVar278;
    fVar280 = fVar226 * auVar213._16_4_ * 3.0;
    auVar25._16_4_ = fVar280;
    fVar282 = fVar231 * auVar213._20_4_ * 3.0;
    auVar25._20_4_ = fVar282;
    fVar284 = fVar177 * auVar213._24_4_ * 3.0;
    auVar25._24_4_ = fVar284;
    auVar25._28_4_ = auVar271._28_4_;
    fVar327 = fVar226 * auVar86._0_4_ * 3.0;
    fVar331 = fVar231 * auVar86._4_4_ * 3.0;
    auVar20._4_4_ = fVar331;
    auVar20._0_4_ = fVar327;
    fVar332 = fVar177 * auVar86._8_4_ * 3.0;
    auVar20._8_4_ = fVar332;
    fVar333 = fVar199 * auVar86._12_4_ * 3.0;
    auVar20._12_4_ = fVar333;
    fVar334 = fVar226 * auVar86._16_4_ * 3.0;
    auVar20._16_4_ = fVar334;
    fVar335 = fVar231 * auVar86._20_4_ * 3.0;
    auVar20._20_4_ = fVar335;
    fVar336 = fVar177 * auVar86._24_4_ * 3.0;
    auVar20._24_4_ = fVar336;
    auVar20._28_4_ = fVar337;
    fVar174 = fVar226 * auVar123._0_4_ * 3.0;
    fVar176 = fVar231 * auVar123._4_4_ * 3.0;
    auVar142._4_4_ = fVar176;
    auVar142._0_4_ = fVar174;
    fVar178 = fVar177 * auVar123._8_4_ * 3.0;
    auVar142._8_4_ = fVar178;
    fVar200 = fVar199 * auVar123._12_4_ * 3.0;
    auVar142._12_4_ = fVar200;
    fVar226 = fVar226 * auVar123._16_4_ * 3.0;
    auVar142._16_4_ = fVar226;
    fVar231 = fVar231 * auVar123._20_4_ * 3.0;
    auVar142._20_4_ = fVar231;
    fVar177 = fVar177 * auVar123._24_4_ * 3.0;
    auVar142._24_4_ = fVar177;
    auVar142._28_4_ = fVar199;
    auVar85 = vperm2f128_avx(auVar354,auVar354,1);
    auVar85 = vshufps_avx(auVar85,auVar354,0x30);
    _local_ac0 = vshufps_avx(auVar354,auVar85,0x29);
    auVar85 = vperm2f128_avx(auVar362,auVar362,1);
    auVar85 = vshufps_avx(auVar85,auVar362,0x30);
    _local_9c0 = vshufps_avx(auVar362,auVar85,0x29);
    auVar213 = vsubps_avx(auVar290,auVar142);
    auVar85 = vperm2f128_avx(auVar213,auVar213,1);
    auVar85 = vshufps_avx(auVar85,auVar213,0x30);
    auVar123 = vshufps_avx(auVar213,auVar85,0x29);
    auVar86 = vsubps_avx(_local_ac0,auVar354);
    auVar142 = vsubps_avx(_local_9c0,auVar362);
    fVar222 = auVar86._0_4_;
    fVar246 = auVar86._4_4_;
    auVar19._4_4_ = fVar331 * fVar246;
    auVar19._0_4_ = fVar327 * fVar222;
    fVar179 = auVar86._8_4_;
    auVar19._8_4_ = fVar332 * fVar179;
    fVar202 = auVar86._12_4_;
    auVar19._12_4_ = fVar333 * fVar202;
    fVar230 = auVar86._16_4_;
    auVar19._16_4_ = fVar334 * fVar230;
    fVar264 = auVar86._20_4_;
    auVar19._20_4_ = fVar335 * fVar264;
    fVar353 = auVar86._24_4_;
    auVar19._24_4_ = fVar336 * fVar353;
    auVar19._28_4_ = auVar213._28_4_;
    fVar317 = auVar142._0_4_;
    fVar320 = auVar142._4_4_;
    auVar291._4_4_ = fVar320 * fVar275;
    auVar291._0_4_ = fVar317 * fVar267;
    fVar321 = auVar142._8_4_;
    auVar291._8_4_ = fVar321 * fVar276;
    fVar322 = auVar142._12_4_;
    auVar291._12_4_ = fVar322 * fVar278;
    fVar323 = auVar142._16_4_;
    auVar291._16_4_ = fVar323 * fVar280;
    fVar324 = auVar142._20_4_;
    auVar291._20_4_ = fVar324 * fVar282;
    fVar325 = auVar142._24_4_;
    auVar291._24_4_ = fVar325 * fVar284;
    auVar291._28_4_ = auVar85._28_4_;
    auVar86 = vsubps_avx(auVar291,auVar19);
    auVar85 = vperm2f128_avx(auVar341,auVar341,1);
    auVar85 = vshufps_avx(auVar85,auVar341,0x30);
    auVar142 = vshufps_avx(auVar341,auVar85,0x29);
    auVar168 = vsubps_avx(auVar142,auVar341);
    auVar358._4_4_ = fVar320 * fVar248;
    auVar358._0_4_ = fVar317 * fVar233;
    auVar358._8_4_ = fVar321 * fVar252;
    auVar358._12_4_ = fVar322 * fVar256;
    auVar358._16_4_ = fVar323 * fVar259;
    auVar358._20_4_ = fVar324 * fVar262;
    auVar358._24_4_ = fVar325 * fVar265;
    auVar358._28_4_ = auVar142._28_4_;
    fVar172 = auVar168._0_4_;
    fVar250 = auVar168._4_4_;
    auVar21._4_4_ = fVar331 * fVar250;
    auVar21._0_4_ = fVar327 * fVar172;
    fVar180 = auVar168._8_4_;
    auVar21._8_4_ = fVar332 * fVar180;
    fVar204 = auVar168._12_4_;
    auVar21._12_4_ = fVar333 * fVar204;
    fVar232 = auVar168._16_4_;
    auVar21._16_4_ = fVar334 * fVar232;
    fVar286 = auVar168._20_4_;
    auVar21._20_4_ = fVar335 * fVar286;
    fVar10 = auVar168._24_4_;
    auVar21._24_4_ = fVar336 * fVar10;
    auVar21._28_4_ = local_9c0._28_4_;
    auVar19 = vsubps_avx(auVar21,auVar358);
    auVar22._4_4_ = fVar250 * fVar275;
    auVar22._0_4_ = fVar172 * fVar267;
    auVar22._8_4_ = fVar180 * fVar276;
    auVar22._12_4_ = fVar204 * fVar278;
    auVar22._16_4_ = fVar232 * fVar280;
    auVar22._20_4_ = fVar286 * fVar282;
    auVar22._24_4_ = fVar10 * fVar284;
    auVar22._28_4_ = local_9c0._28_4_;
    auVar292._4_4_ = fVar248 * fVar246;
    auVar292._0_4_ = fVar233 * fVar222;
    auVar292._8_4_ = fVar252 * fVar179;
    auVar292._12_4_ = fVar256 * fVar202;
    auVar292._16_4_ = fVar259 * fVar230;
    auVar292._20_4_ = fVar262 * fVar264;
    auVar292._24_4_ = fVar265 * fVar353;
    auVar292._28_4_ = auVar314._28_4_;
    auVar291 = vsubps_avx(auVar292,auVar22);
    fVar152 = auVar291._28_4_;
    auVar141._0_4_ = fVar172 * fVar172 + fVar222 * fVar222 + fVar317 * fVar317;
    auVar141._4_4_ = fVar250 * fVar250 + fVar246 * fVar246 + fVar320 * fVar320;
    auVar141._8_4_ = fVar180 * fVar180 + fVar179 * fVar179 + fVar321 * fVar321;
    auVar141._12_4_ = fVar204 * fVar204 + fVar202 * fVar202 + fVar322 * fVar322;
    auVar141._16_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar323 * fVar323;
    auVar141._20_4_ = fVar286 * fVar286 + fVar264 * fVar264 + fVar324 * fVar324;
    auVar141._24_4_ = fVar10 * fVar10 + fVar353 * fVar353 + fVar325 * fVar325;
    auVar141._28_4_ = fVar152 + fVar152 + auVar86._28_4_;
    auVar85 = vrcpps_avx(auVar141);
    fVar201 = auVar85._0_4_;
    fVar227 = auVar85._4_4_;
    auVar18._4_4_ = fVar227 * auVar141._4_4_;
    auVar18._0_4_ = fVar201 * auVar141._0_4_;
    fVar228 = auVar85._8_4_;
    auVar18._8_4_ = fVar228 * auVar141._8_4_;
    fVar229 = auVar85._12_4_;
    auVar18._12_4_ = fVar229 * auVar141._12_4_;
    fVar255 = auVar85._16_4_;
    auVar18._16_4_ = fVar255 * auVar141._16_4_;
    fVar258 = auVar85._20_4_;
    auVar18._20_4_ = fVar258 * auVar141._20_4_;
    fVar261 = auVar85._24_4_;
    auVar18._24_4_ = fVar261 * auVar141._24_4_;
    auVar18._28_4_ = auVar314._28_4_;
    auVar342._8_4_ = 0x3f800000;
    auVar342._0_8_ = 0x3f8000003f800000;
    auVar342._12_4_ = 0x3f800000;
    auVar342._16_4_ = 0x3f800000;
    auVar342._20_4_ = 0x3f800000;
    auVar342._24_4_ = 0x3f800000;
    auVar342._28_4_ = 0x3f800000;
    auVar358 = vsubps_avx(auVar342,auVar18);
    fVar201 = auVar358._0_4_ * fVar201 + fVar201;
    fVar227 = auVar358._4_4_ * fVar227 + fVar227;
    fVar228 = auVar358._8_4_ * fVar228 + fVar228;
    fVar229 = auVar358._12_4_ * fVar229 + fVar229;
    fVar255 = auVar358._16_4_ * fVar255 + fVar255;
    fVar258 = auVar358._20_4_ * fVar258 + fVar258;
    fVar261 = auVar358._24_4_ * fVar261 + fVar261;
    auVar213 = vperm2f128_avx(auVar25,auVar25,1);
    auVar213 = vshufps_avx(auVar213,auVar25,0x30);
    local_960 = vshufps_avx(auVar25,auVar213,0x29);
    auVar213 = vperm2f128_avx(auVar20,auVar20,1);
    auVar213 = vshufps_avx(auVar213,auVar20,0x30);
    local_980 = vshufps_avx(auVar20,auVar213,0x29);
    fVar338 = local_980._0_4_;
    fVar347 = local_980._4_4_;
    auVar23._4_4_ = fVar347 * fVar246;
    auVar23._0_4_ = fVar338 * fVar222;
    fVar348 = local_980._8_4_;
    auVar23._8_4_ = fVar348 * fVar179;
    fVar349 = local_980._12_4_;
    auVar23._12_4_ = fVar349 * fVar202;
    fVar350 = local_980._16_4_;
    auVar23._16_4_ = fVar350 * fVar230;
    fVar351 = local_980._20_4_;
    auVar23._20_4_ = fVar351 * fVar264;
    fVar352 = local_980._24_4_;
    auVar23._24_4_ = fVar352 * fVar353;
    auVar23._28_4_ = auVar213._28_4_;
    fVar224 = local_960._0_4_;
    fVar254 = local_960._4_4_;
    auVar24._4_4_ = fVar320 * fVar254;
    auVar24._0_4_ = fVar317 * fVar224;
    fVar197 = local_960._8_4_;
    auVar24._8_4_ = fVar321 * fVar197;
    fVar223 = local_960._12_4_;
    auVar24._12_4_ = fVar322 * fVar223;
    fVar247 = local_960._16_4_;
    auVar24._16_4_ = fVar323 * fVar247;
    fVar297 = local_960._20_4_;
    auVar24._20_4_ = fVar324 * fVar297;
    fVar11 = local_960._24_4_;
    auVar24._24_4_ = fVar325 * fVar11;
    auVar24._28_4_ = fVar337;
    auVar20 = vsubps_avx(auVar24,auVar23);
    auVar213 = vperm2f128_avx(auVar359,auVar359,1);
    auVar213 = vshufps_avx(auVar213,auVar359,0x30);
    local_740 = vshufps_avx(auVar359,auVar213,0x29);
    fVar173 = local_740._0_4_;
    fVar175 = local_740._4_4_;
    auVar26._4_4_ = fVar320 * fVar175;
    auVar26._0_4_ = fVar317 * fVar173;
    fVar198 = local_740._8_4_;
    auVar26._8_4_ = fVar321 * fVar198;
    fVar225 = local_740._12_4_;
    auVar26._12_4_ = fVar322 * fVar225;
    fVar251 = local_740._16_4_;
    auVar26._16_4_ = fVar323 * fVar251;
    fVar298 = local_740._20_4_;
    auVar26._20_4_ = fVar324 * fVar298;
    fVar12 = local_740._24_4_;
    auVar26._24_4_ = fVar325 * fVar12;
    auVar26._28_4_ = auVar213._28_4_;
    auVar27._4_4_ = fVar347 * fVar250;
    auVar27._0_4_ = fVar338 * fVar172;
    auVar27._8_4_ = fVar348 * fVar180;
    auVar27._12_4_ = fVar349 * fVar204;
    auVar27._16_4_ = fVar350 * fVar232;
    auVar27._20_4_ = fVar351 * fVar286;
    uVar69 = local_980._28_4_;
    auVar27._24_4_ = fVar352 * fVar10;
    auVar27._28_4_ = uVar69;
    auVar213 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar250 * fVar254;
    auVar28._0_4_ = fVar172 * fVar224;
    auVar28._8_4_ = fVar180 * fVar197;
    auVar28._12_4_ = fVar204 * fVar223;
    auVar28._16_4_ = fVar232 * fVar247;
    auVar28._20_4_ = fVar286 * fVar297;
    auVar28._24_4_ = fVar10 * fVar11;
    auVar28._28_4_ = uVar69;
    auVar29._4_4_ = fVar175 * fVar246;
    auVar29._0_4_ = fVar173 * fVar222;
    auVar29._8_4_ = fVar198 * fVar179;
    auVar29._12_4_ = fVar225 * fVar202;
    auVar29._16_4_ = fVar251 * fVar230;
    auVar29._20_4_ = fVar298 * fVar264;
    auVar29._24_4_ = fVar12 * fVar353;
    auVar29._28_4_ = auVar354._28_4_;
    auVar359 = vsubps_avx(auVar29,auVar28);
    auVar30._4_4_ =
         (auVar86._4_4_ * auVar86._4_4_ +
         auVar19._4_4_ * auVar19._4_4_ + auVar291._4_4_ * auVar291._4_4_) * fVar227;
    auVar30._0_4_ =
         (auVar86._0_4_ * auVar86._0_4_ +
         auVar19._0_4_ * auVar19._0_4_ + auVar291._0_4_ * auVar291._0_4_) * fVar201;
    auVar30._8_4_ =
         (auVar86._8_4_ * auVar86._8_4_ +
         auVar19._8_4_ * auVar19._8_4_ + auVar291._8_4_ * auVar291._8_4_) * fVar228;
    auVar30._12_4_ =
         (auVar86._12_4_ * auVar86._12_4_ +
         auVar19._12_4_ * auVar19._12_4_ + auVar291._12_4_ * auVar291._12_4_) * fVar229;
    auVar30._16_4_ =
         (auVar86._16_4_ * auVar86._16_4_ +
         auVar19._16_4_ * auVar19._16_4_ + auVar291._16_4_ * auVar291._16_4_) * fVar255;
    auVar30._20_4_ =
         (auVar86._20_4_ * auVar86._20_4_ +
         auVar19._20_4_ * auVar19._20_4_ + auVar291._20_4_ * auVar291._20_4_) * fVar258;
    auVar30._24_4_ =
         (auVar86._24_4_ * auVar86._24_4_ +
         auVar19._24_4_ * auVar19._24_4_ + auVar291._24_4_ * auVar291._24_4_) * fVar261;
    auVar30._28_4_ = auVar86._28_4_ + auVar19._28_4_ + fVar152;
    auVar31._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar213._4_4_ * auVar213._4_4_ + auVar359._4_4_ * auVar359._4_4_) * fVar227;
    auVar31._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar213._0_4_ * auVar213._0_4_ + auVar359._0_4_ * auVar359._0_4_) * fVar201;
    auVar31._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar213._8_4_ * auVar213._8_4_ + auVar359._8_4_ * auVar359._8_4_) * fVar228;
    auVar31._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar213._12_4_ * auVar213._12_4_ + auVar359._12_4_ * auVar359._12_4_) * fVar229;
    auVar31._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar213._16_4_ * auVar213._16_4_ + auVar359._16_4_ * auVar359._16_4_) * fVar255;
    auVar31._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar213._20_4_ * auVar213._20_4_ + auVar359._20_4_ * auVar359._20_4_) * fVar258;
    auVar31._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar213._24_4_ * auVar213._24_4_ + auVar359._24_4_ * auVar359._24_4_) * fVar261;
    auVar31._28_4_ = auVar358._28_4_ + auVar85._28_4_;
    auVar85 = vmaxps_avx(auVar30,auVar31);
    auVar213 = vperm2f128_avx(auVar290,auVar290,1);
    auVar213 = vshufps_avx(auVar213,auVar290,0x30);
    auVar19 = vshufps_avx(auVar290,auVar213,0x29);
    auVar87._0_4_ = auVar290._0_4_ + fVar174;
    auVar87._4_4_ = auVar290._4_4_ + fVar176;
    auVar87._8_4_ = auVar290._8_4_ + fVar178;
    auVar87._12_4_ = auVar290._12_4_ + fVar200;
    auVar87._16_4_ = auVar290._16_4_ + fVar226;
    auVar87._20_4_ = auVar290._20_4_ + fVar231;
    auVar87._24_4_ = auVar290._24_4_ + fVar177;
    auVar87._28_4_ = auVar290._28_4_ + fVar199;
    auVar213 = vmaxps_avx(auVar290,auVar87);
    auVar86 = vmaxps_avx(auVar123,auVar19);
    auVar213 = vmaxps_avx(auVar213,auVar86);
    auVar86 = vrsqrtps_avx(auVar141);
    fVar152 = auVar86._0_4_;
    fVar226 = auVar86._4_4_;
    fVar174 = auVar86._8_4_;
    fVar231 = auVar86._12_4_;
    fVar176 = auVar86._16_4_;
    fVar177 = auVar86._20_4_;
    fVar178 = auVar86._24_4_;
    local_340 = fVar152 * 1.5 + fVar152 * fVar152 * fVar152 * auVar141._0_4_ * -0.5;
    fStack_33c = fVar226 * 1.5 + fVar226 * fVar226 * fVar226 * auVar141._4_4_ * -0.5;
    fStack_338 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar141._8_4_ * -0.5;
    fStack_334 = fVar231 * 1.5 + fVar231 * fVar231 * fVar231 * auVar141._12_4_ * -0.5;
    fStack_330 = fVar176 * 1.5 + fVar176 * fVar176 * fVar176 * auVar141._16_4_ * -0.5;
    fStack_32c = fVar177 * 1.5 + fVar177 * fVar177 * fVar177 * auVar141._20_4_ * -0.5;
    fStack_328 = fVar178 * 1.5 + fVar178 * fVar178 * fVar178 * auVar141._24_4_ * -0.5;
    auVar291 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar358 = vsubps_avx(auVar291,auVar354);
    auVar20 = vsubps_avx(auVar291,auVar362);
    fVar226 = auVar20._0_4_;
    fVar176 = auVar20._4_4_;
    fVar199 = auVar20._8_4_;
    fVar227 = auVar20._12_4_;
    fVar255 = auVar20._16_4_;
    fVar299 = auVar20._20_4_;
    fVar13 = auVar20._24_4_;
    fVar174 = auVar358._0_4_;
    fVar177 = auVar358._4_4_;
    fVar200 = auVar358._8_4_;
    fVar228 = auVar358._12_4_;
    fVar258 = auVar358._16_4_;
    fVar326 = auVar358._20_4_;
    fVar14 = auVar358._24_4_;
    auVar292 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar21 = vsubps_avx(auVar292,auVar341);
    fVar231 = auVar21._0_4_;
    fVar178 = auVar21._4_4_;
    fVar201 = auVar21._8_4_;
    fVar229 = auVar21._12_4_;
    fVar261 = auVar21._16_4_;
    fVar337 = auVar21._20_4_;
    fVar15 = auVar21._24_4_;
    auVar343._0_4_ =
         (float)local_800._0_4_ * fVar231 +
         (float)local_820._0_4_ * fVar174 + (float)local_7a0._0_4_ * fVar226;
    auVar343._4_4_ =
         (float)local_800._4_4_ * fVar178 +
         (float)local_820._4_4_ * fVar177 + (float)local_7a0._4_4_ * fVar176;
    auVar343._8_4_ = fStack_7f8 * fVar201 + fStack_818 * fVar200 + fStack_798 * fVar199;
    auVar343._12_4_ = fStack_7f4 * fVar229 + fStack_814 * fVar228 + fStack_794 * fVar227;
    auVar343._16_4_ = fStack_7f0 * fVar261 + fStack_810 * fVar258 + fStack_790 * fVar255;
    auVar343._20_4_ = fStack_7ec * fVar337 + fStack_80c * fVar326 + fStack_78c * fVar299;
    auVar343._24_4_ = fStack_7e8 * fVar15 + fStack_808 * fVar14 + fStack_788 * fVar13;
    auVar343._28_4_ = auVar354._28_4_ + auVar359._28_4_ + 1.5;
    auVar355._0_4_ = fVar231 * fVar231 + fVar174 * fVar174 + fVar226 * fVar226;
    auVar355._4_4_ = fVar178 * fVar178 + fVar177 * fVar177 + fVar176 * fVar176;
    auVar355._8_4_ = fVar201 * fVar201 + fVar200 * fVar200 + fVar199 * fVar199;
    auVar355._12_4_ = fVar229 * fVar229 + fVar228 * fVar228 + fVar227 * fVar227;
    auVar355._16_4_ = fVar261 * fVar261 + fVar258 * fVar258 + fVar255 * fVar255;
    auVar355._20_4_ = fVar337 * fVar337 + fVar326 * fVar326 + fVar299 * fVar299;
    auVar355._24_4_ = fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13;
    auVar355._28_4_ = auVar362._28_4_ + auVar362._28_4_ + auVar354._28_4_;
    fVar300 = (float)local_800._0_4_ * fVar172 * local_340 +
              local_340 * fVar222 * (float)local_820._0_4_ +
              fVar317 * local_340 * (float)local_7a0._0_4_;
    fVar304 = (float)local_800._4_4_ * fVar250 * fStack_33c +
              fStack_33c * fVar246 * (float)local_820._4_4_ +
              fVar320 * fStack_33c * (float)local_7a0._4_4_;
    fVar305 = fStack_7f8 * fVar180 * fStack_338 +
              fStack_338 * fVar179 * fStack_818 + fVar321 * fStack_338 * fStack_798;
    fVar306 = fStack_7f4 * fVar204 * fStack_334 +
              fStack_334 * fVar202 * fStack_814 + fVar322 * fStack_334 * fStack_794;
    fVar307 = fStack_7f0 * fVar232 * fStack_330 +
              fStack_330 * fVar230 * fStack_810 + fVar323 * fStack_330 * fStack_790;
    fVar309 = fStack_7ec * fVar286 * fStack_32c +
              fStack_32c * fVar264 * fStack_80c + fVar324 * fStack_32c * fStack_78c;
    fVar311 = fStack_7e8 * fVar10 * fStack_328 +
              fStack_328 * fVar353 * fStack_808 + fVar325 * fStack_328 * fStack_788;
    fVar152 = fStack_7e4 + fStack_804 + fStack_784;
    local_9a0 = fVar231 * fVar172 * local_340 +
                local_340 * fVar222 * fVar174 + fVar317 * local_340 * fVar226;
    fStack_99c = fVar178 * fVar250 * fStack_33c +
                 fStack_33c * fVar246 * fVar177 + fVar320 * fStack_33c * fVar176;
    fStack_998 = fVar201 * fVar180 * fStack_338 +
                 fStack_338 * fVar179 * fVar200 + fVar321 * fStack_338 * fVar199;
    fStack_994 = fVar229 * fVar204 * fStack_334 +
                 fStack_334 * fVar202 * fVar228 + fVar322 * fStack_334 * fVar227;
    fStack_990 = fVar261 * fVar232 * fStack_330 +
                 fStack_330 * fVar230 * fVar258 + fVar323 * fStack_330 * fVar255;
    fStack_98c = fVar337 * fVar286 * fStack_32c +
                 fStack_32c * fVar264 * fVar326 + fVar324 * fStack_32c * fVar299;
    fStack_988 = fVar15 * fVar10 * fStack_328 +
                 fStack_328 * fVar353 * fVar14 + fVar325 * fStack_328 * fVar13;
    fStack_984 = fStack_804 + fVar152;
    auVar32._4_4_ = fVar304 * fStack_99c;
    auVar32._0_4_ = fVar300 * local_9a0;
    auVar32._8_4_ = fVar305 * fStack_998;
    auVar32._12_4_ = fVar306 * fStack_994;
    auVar32._16_4_ = fVar307 * fStack_990;
    auVar32._20_4_ = fVar309 * fStack_98c;
    auVar32._24_4_ = fVar311 * fStack_988;
    auVar32._28_4_ = fVar152;
    auVar359 = vsubps_avx(auVar343,auVar32);
    auVar33._4_4_ = fStack_99c * fStack_99c;
    auVar33._0_4_ = local_9a0 * local_9a0;
    auVar33._8_4_ = fStack_998 * fStack_998;
    auVar33._12_4_ = fStack_994 * fStack_994;
    auVar33._16_4_ = fStack_990 * fStack_990;
    auVar33._20_4_ = fStack_98c * fStack_98c;
    auVar33._24_4_ = fStack_988 * fStack_988;
    auVar33._28_4_ = fStack_804;
    auVar22 = vsubps_avx(auVar355,auVar33);
    auVar291 = vsqrtps_avx(auVar85);
    fVar152 = (auVar291._0_4_ + auVar213._0_4_) * 1.0000002;
    fVar101 = (auVar291._4_4_ + auVar213._4_4_) * 1.0000002;
    fVar103 = (auVar291._8_4_ + auVar213._8_4_) * 1.0000002;
    fVar105 = (auVar291._12_4_ + auVar213._12_4_) * 1.0000002;
    fVar106 = (auVar291._16_4_ + auVar213._16_4_) * 1.0000002;
    fVar107 = (auVar291._20_4_ + auVar213._20_4_) * 1.0000002;
    fVar108 = (auVar291._24_4_ + auVar213._24_4_) * 1.0000002;
    auVar34._4_4_ = fVar101 * fVar101;
    auVar34._0_4_ = fVar152 * fVar152;
    auVar34._8_4_ = fVar103 * fVar103;
    auVar34._12_4_ = fVar105 * fVar105;
    auVar34._16_4_ = fVar106 * fVar106;
    auVar34._20_4_ = fVar107 * fVar107;
    auVar34._24_4_ = fVar108 * fVar108;
    auVar34._28_4_ = auVar291._28_4_ + auVar213._28_4_;
    fVar101 = auVar359._0_4_ + auVar359._0_4_;
    fVar103 = auVar359._4_4_ + auVar359._4_4_;
    local_920._0_8_ = CONCAT44(fVar103,fVar101);
    local_920._8_4_ = auVar359._8_4_ + auVar359._8_4_;
    local_920._12_4_ = auVar359._12_4_ + auVar359._12_4_;
    local_920._16_4_ = auVar359._16_4_ + auVar359._16_4_;
    local_920._20_4_ = auVar359._20_4_ + auVar359._20_4_;
    local_920._24_4_ = auVar359._24_4_ + auVar359._24_4_;
    fVar152 = auVar359._28_4_;
    local_920._28_4_ = fVar152 + fVar152;
    auVar213 = vsubps_avx(auVar22,auVar34);
    local_360._4_4_ = fVar304 * fVar304;
    local_360._0_4_ = fVar300 * fVar300;
    local_360._8_4_ = fVar305 * fVar305;
    local_360._12_4_ = fVar306 * fVar306;
    local_360._16_4_ = fVar307 * fVar307;
    local_360._20_4_ = fVar309 * fVar309;
    local_360._24_4_ = fVar311 * fVar311;
    local_360._28_4_ = auVar22._28_4_;
    local_4a0 = vsubps_avx(local_2a0,local_360);
    auVar35._4_4_ = fVar103 * fVar103;
    auVar35._0_4_ = fVar101 * fVar101;
    auVar35._8_4_ = local_920._8_4_ * local_920._8_4_;
    auVar35._12_4_ = local_920._12_4_ * local_920._12_4_;
    auVar35._16_4_ = local_920._16_4_ * local_920._16_4_;
    auVar35._20_4_ = local_920._20_4_ * local_920._20_4_;
    auVar35._24_4_ = local_920._24_4_ * local_920._24_4_;
    auVar35._28_4_ = fVar152;
    auStack_8f8 = auVar35._8_24_;
    fVar105 = local_4a0._0_4_;
    fVar106 = local_4a0._4_4_;
    fVar107 = local_4a0._8_4_;
    fVar108 = local_4a0._12_4_;
    fVar308 = local_4a0._16_4_;
    fVar310 = local_4a0._20_4_;
    fVar312 = local_4a0._24_4_;
    auVar36._4_4_ = auVar213._4_4_ * fVar106 * 4.0;
    auVar36._0_4_ = auVar213._0_4_ * fVar105 * 4.0;
    auVar36._8_4_ = auVar213._8_4_ * fVar107 * 4.0;
    auVar36._12_4_ = auVar213._12_4_ * fVar108 * 4.0;
    auVar36._16_4_ = auVar213._16_4_ * fVar308 * 4.0;
    auVar36._20_4_ = auVar213._20_4_ * fVar310 * 4.0;
    auVar36._24_4_ = auVar213._24_4_ * fVar312 * 4.0;
    auVar36._28_4_ = 0x40800000;
    auVar359 = vsubps_avx(auVar35,auVar36);
    auVar85 = vcmpps_avx(auVar359,auVar292,5);
    fVar152 = local_4a0._28_4_;
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0x7f,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar85 >> 0xbf,0) == '\0') &&
        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f]) {
      local_c80._8_4_ = 0x7f800000;
      local_c80._0_8_ = 0x7f8000007f800000;
      local_c80._12_4_ = 0x7f800000;
      local_c80._16_4_ = 0x7f800000;
      local_c80._20_4_ = 0x7f800000;
      local_c80._24_4_ = 0x7f800000;
      local_c80._28_4_ = 0x7f800000;
      auVar356._8_4_ = 0xff800000;
      auVar356._0_8_ = 0xff800000ff800000;
      auVar356._12_4_ = 0xff800000;
      auVar356._16_4_ = 0xff800000;
      auVar356._20_4_ = 0xff800000;
      auVar356._24_4_ = 0xff800000;
      auVar356._28_4_ = 0xff800000;
    }
    else {
      auVar292 = vcmpps_avx(auVar359,auVar292,5);
      auVar18 = vsqrtps_avx(auVar359);
      auVar239._0_4_ = fVar105 + fVar105;
      auVar239._4_4_ = fVar106 + fVar106;
      auVar239._8_4_ = fVar107 + fVar107;
      auVar239._12_4_ = fVar108 + fVar108;
      auVar239._16_4_ = fVar308 + fVar308;
      auVar239._20_4_ = fVar310 + fVar310;
      auVar239._24_4_ = fVar312 + fVar312;
      auVar239._28_4_ = fVar152 + fVar152;
      auVar359 = vrcpps_avx(auVar239);
      fVar234 = auVar359._0_4_;
      fVar249 = auVar359._4_4_;
      auVar37._4_4_ = auVar239._4_4_ * fVar249;
      auVar37._0_4_ = auVar239._0_4_ * fVar234;
      fVar253 = auVar359._8_4_;
      auVar37._8_4_ = auVar239._8_4_ * fVar253;
      fVar257 = auVar359._12_4_;
      auVar37._12_4_ = auVar239._12_4_ * fVar257;
      fVar260 = auVar359._16_4_;
      auVar37._16_4_ = auVar239._16_4_ * fVar260;
      fVar263 = auVar359._20_4_;
      auVar37._20_4_ = auVar239._20_4_ * fVar263;
      fVar266 = auVar359._24_4_;
      auVar37._24_4_ = auVar239._24_4_ * fVar266;
      auVar37._28_4_ = auVar239._28_4_;
      auVar293._8_4_ = 0x3f800000;
      auVar293._0_8_ = 0x3f8000003f800000;
      auVar293._12_4_ = 0x3f800000;
      auVar293._16_4_ = 0x3f800000;
      auVar293._20_4_ = 0x3f800000;
      auVar293._24_4_ = 0x3f800000;
      auVar293._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar293,auVar37);
      fVar234 = fVar234 + fVar234 * auVar23._0_4_;
      fVar249 = fVar249 + fVar249 * auVar23._4_4_;
      fVar253 = fVar253 + fVar253 * auVar23._8_4_;
      fVar257 = fVar257 + fVar257 * auVar23._12_4_;
      fVar260 = fVar260 + fVar260 * auVar23._16_4_;
      fVar263 = fVar263 + fVar263 * auVar23._20_4_;
      fVar266 = fVar266 + fVar266 * auVar23._24_4_;
      auVar272._0_8_ = CONCAT44(fVar103,fVar101) ^ 0x8000000080000000;
      auVar272._8_4_ = -local_920._8_4_;
      auVar272._12_4_ = -local_920._12_4_;
      auVar272._16_4_ = -local_920._16_4_;
      auVar272._20_4_ = -local_920._20_4_;
      auVar272._24_4_ = -local_920._24_4_;
      auVar272._28_4_ = -local_920._28_4_;
      auVar24 = vsubps_avx(auVar272,auVar18);
      fVar101 = auVar24._0_4_ * fVar234;
      fVar103 = auVar24._4_4_ * fVar249;
      auVar38._4_4_ = fVar103;
      auVar38._0_4_ = fVar101;
      fVar277 = auVar24._8_4_ * fVar253;
      auVar38._8_4_ = fVar277;
      fVar279 = auVar24._12_4_ * fVar257;
      auVar38._12_4_ = fVar279;
      fVar281 = auVar24._16_4_ * fVar260;
      auVar38._16_4_ = fVar281;
      fVar283 = auVar24._20_4_ * fVar263;
      auVar38._20_4_ = fVar283;
      fVar285 = auVar24._24_4_ * fVar266;
      auVar38._24_4_ = fVar285;
      auVar38._28_4_ = auVar24._28_4_;
      auVar18 = vsubps_avx(auVar18,local_920);
      fVar234 = auVar18._0_4_ * fVar234;
      fVar249 = auVar18._4_4_ * fVar249;
      auVar39._4_4_ = fVar249;
      auVar39._0_4_ = fVar234;
      fVar253 = auVar18._8_4_ * fVar253;
      auVar39._8_4_ = fVar253;
      fVar257 = auVar18._12_4_ * fVar257;
      auVar39._12_4_ = fVar257;
      fVar260 = auVar18._16_4_ * fVar260;
      auVar39._16_4_ = fVar260;
      fVar263 = auVar18._20_4_ * fVar263;
      auVar39._20_4_ = fVar263;
      fVar266 = auVar18._24_4_ * fVar266;
      auVar39._24_4_ = fVar266;
      auVar39._28_4_ = auVar18._28_4_;
      local_9e0._4_4_ = fStack_33c * (fStack_99c + fVar304 * fVar103);
      local_9e0._0_4_ = local_340 * (local_9a0 + fVar300 * fVar101);
      uStack_9d8._0_4_ = (uint)(fStack_338 * (fStack_998 + fVar305 * fVar277));
      uStack_9d8._4_4_ = (uint)(fStack_334 * (fStack_994 + fVar306 * fVar279));
      uStack_9d0._0_4_ = (uint)(fStack_330 * (fStack_990 + fVar307 * fVar281));
      uStack_9d0._4_4_ = (uint)(fStack_32c * (fStack_98c + fVar309 * fVar283));
      uStack_9c8._0_4_ = (uint)(fStack_328 * (fStack_988 + fVar311 * fVar285));
      uStack_9c8._4_4_ = (uint)(fStack_984 + auVar359._28_4_ + auVar23._28_4_);
      auVar294._8_4_ = 0x7fffffff;
      auVar294._0_8_ = 0x7fffffff7fffffff;
      auVar294._12_4_ = 0x7fffffff;
      auVar294._16_4_ = 0x7fffffff;
      auVar294._20_4_ = 0x7fffffff;
      auVar294._24_4_ = 0x7fffffff;
      auVar294._28_4_ = 0x7fffffff;
      auVar359 = vandps_avx(local_360,auVar294);
      auVar18 = vmaxps_avx(local_440,auVar359);
      auVar40._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar40._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar40._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar40._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar40._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar40._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar40._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar40._28_4_ = auVar18._28_4_;
      auVar359 = vandps_avx(local_4a0,auVar294);
      auVar359 = vcmpps_avx(auVar359,auVar40,1);
      auVar295._8_4_ = 0x7f800000;
      auVar295._0_8_ = 0x7f8000007f800000;
      auVar295._12_4_ = 0x7f800000;
      auVar295._16_4_ = 0x7f800000;
      auVar295._20_4_ = 0x7f800000;
      auVar295._24_4_ = 0x7f800000;
      auVar295._28_4_ = 0x7f800000;
      local_c80 = vblendvps_avx(auVar295,auVar38,auVar292);
      local_320 = local_340 * (local_9a0 + fVar300 * fVar234);
      fStack_31c = fStack_33c * (fStack_99c + fVar304 * fVar249);
      fStack_318 = fStack_338 * (fStack_998 + fVar305 * fVar253);
      fStack_314 = fStack_334 * (fStack_994 + fVar306 * fVar257);
      fStack_310 = fStack_330 * (fStack_990 + fVar307 * fVar260);
      fStack_30c = fStack_32c * (fStack_98c + fVar309 * fVar263);
      fStack_308 = fStack_328 * (fStack_988 + fVar311 * fVar266);
      fStack_304 = fStack_984 + auVar18._28_4_;
      auVar240._8_4_ = 0xff800000;
      auVar240._0_8_ = 0xff800000ff800000;
      auVar240._12_4_ = 0xff800000;
      auVar240._16_4_ = 0xff800000;
      auVar240._20_4_ = 0xff800000;
      auVar240._24_4_ = 0xff800000;
      auVar240._28_4_ = 0xff800000;
      auVar356 = vblendvps_avx(auVar240,auVar39,auVar292);
      auVar18 = auVar292 & auVar359;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar85 = vandps_avx(auVar359,auVar292);
        auVar208 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        auVar359 = vcmpps_avx(auVar213,ZEXT832(0) << 0x20,2);
        auVar345._8_4_ = 0xff800000;
        auVar345._0_8_ = 0xff800000ff800000;
        auVar345._12_4_ = 0xff800000;
        auVar345._16_4_ = 0xff800000;
        auVar345._20_4_ = 0xff800000;
        auVar345._24_4_ = 0xff800000;
        auVar345._28_4_ = 0xff800000;
        auVar363._8_4_ = 0x7f800000;
        auVar363._0_8_ = 0x7f8000007f800000;
        auVar363._12_4_ = 0x7f800000;
        auVar363._16_4_ = 0x7f800000;
        auVar363._20_4_ = 0x7f800000;
        auVar363._24_4_ = 0x7f800000;
        auVar363._28_4_ = 0x7f800000;
        auVar213 = vblendvps_avx(auVar363,auVar345,auVar359);
        auVar165 = vpmovsxwd_avx(auVar208);
        auVar208 = vpunpckhwd_avx(auVar208,auVar208);
        auVar221._16_16_ = auVar208;
        auVar221._0_16_ = auVar165;
        local_c80 = vblendvps_avx(local_c80,auVar213,auVar221);
        auVar213 = vblendvps_avx(auVar345,auVar363,auVar359);
        auVar356 = vblendvps_avx(auVar356,auVar213,auVar221);
        auVar213 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar98._0_4_ = auVar85._0_4_ ^ auVar213._0_4_;
        auVar98._4_4_ = auVar85._4_4_ ^ auVar213._4_4_;
        auVar98._8_4_ = auVar85._8_4_ ^ auVar213._8_4_;
        auVar98._12_4_ = auVar85._12_4_ ^ auVar213._12_4_;
        auVar98._16_4_ = auVar85._16_4_ ^ auVar213._16_4_;
        auVar98._20_4_ = auVar85._20_4_ ^ auVar213._20_4_;
        auVar98._24_4_ = auVar85._24_4_ ^ auVar213._24_4_;
        auVar98._28_4_ = auVar85._28_4_ ^ auVar213._28_4_;
        auVar85 = vorps_avx(auVar359,auVar98);
        auVar85 = vandps_avx(auVar292,auVar85);
      }
    }
    auVar213 = local_400 & auVar85;
    auVar245 = ZEXT3264(local_aa0);
    auVar365 = ZEXT3264(local_840);
    if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar213 >> 0x7f,0) == '\0') &&
          (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar213 >> 0xbf,0) == '\0') &&
        (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar213[0x1f])
    {
      auVar319 = ZEXT3264(local_a20);
      auVar330 = ZEXT3264(local_a40);
      auVar346 = ZEXT3264(local_a60);
    }
    else {
      fStack_324 = auVar86._28_4_ + auVar141._28_4_;
      local_5f0 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar208 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8a0._0_4_));
      auVar208 = vshufps_avx(auVar208,auVar208,0);
      auVar216._16_16_ = auVar208;
      auVar216._0_16_ = auVar208;
      auVar359 = vminps_avx(auVar216,auVar356);
      fVar263 = auVar20._28_4_;
      auVar124._0_4_ =
           (float)local_800._0_4_ * fVar233 +
           (float)local_820._0_4_ * fVar267 + (float)local_7a0._0_4_ * fVar327;
      auVar124._4_4_ =
           (float)local_800._4_4_ * fVar248 +
           (float)local_820._4_4_ * fVar275 + (float)local_7a0._4_4_ * fVar331;
      auVar124._8_4_ = fStack_7f8 * fVar252 + fStack_818 * fVar276 + fStack_798 * fVar332;
      auVar124._12_4_ = fStack_7f4 * fVar256 + fStack_814 * fVar278 + fStack_794 * fVar333;
      auVar124._16_4_ = fStack_7f0 * fVar259 + fStack_810 * fVar280 + fStack_790 * fVar334;
      auVar124._20_4_ = fStack_7ec * fVar262 + fStack_80c * fVar282 + fStack_78c * fVar335;
      auVar124._24_4_ = fStack_7e8 * fVar265 + fStack_808 * fVar284 + fStack_788 * fVar336;
      auVar124._28_4_ = fVar263 + auVar271._28_4_ + fVar263;
      auVar213 = vrcpps_avx(auVar124);
      fVar101 = auVar213._0_4_;
      fVar103 = auVar213._4_4_;
      auVar41._4_4_ = auVar124._4_4_ * fVar103;
      auVar41._0_4_ = auVar124._0_4_ * fVar101;
      fVar234 = auVar213._8_4_;
      auVar41._8_4_ = auVar124._8_4_ * fVar234;
      fVar249 = auVar213._12_4_;
      auVar41._12_4_ = auVar124._12_4_ * fVar249;
      fVar253 = auVar213._16_4_;
      auVar41._16_4_ = auVar124._16_4_ * fVar253;
      fVar257 = auVar213._20_4_;
      auVar41._20_4_ = auVar124._20_4_ * fVar257;
      fVar260 = auVar213._24_4_;
      auVar41._24_4_ = auVar124._24_4_ * fVar260;
      auVar41._28_4_ = auVar21._28_4_;
      auVar344._8_4_ = 0x3f800000;
      auVar344._0_8_ = 0x3f8000003f800000;
      auVar344._12_4_ = 0x3f800000;
      auVar344._16_4_ = 0x3f800000;
      auVar344._20_4_ = 0x3f800000;
      auVar344._24_4_ = 0x3f800000;
      auVar344._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar344,auVar41);
      auVar273._8_4_ = 0x7fffffff;
      auVar273._0_8_ = 0x7fffffff7fffffff;
      auVar273._12_4_ = 0x7fffffff;
      auVar273._16_4_ = 0x7fffffff;
      auVar273._20_4_ = 0x7fffffff;
      auVar273._24_4_ = 0x7fffffff;
      auVar273._28_4_ = 0x7fffffff;
      auVar213 = vandps_avx(auVar124,auVar273);
      auVar357._8_4_ = 0x219392ef;
      auVar357._0_8_ = 0x219392ef219392ef;
      auVar357._12_4_ = 0x219392ef;
      auVar357._16_4_ = 0x219392ef;
      auVar357._20_4_ = 0x219392ef;
      auVar357._24_4_ = 0x219392ef;
      auVar357._28_4_ = 0x219392ef;
      auVar86 = vcmpps_avx(auVar213,auVar357,1);
      auVar42._4_4_ =
           (fVar103 + fVar103 * auVar20._4_4_) *
           -(fVar178 * fVar248 + fVar177 * fVar275 + fVar176 * fVar331);
      auVar42._0_4_ =
           (fVar101 + fVar101 * auVar20._0_4_) *
           -(fVar231 * fVar233 + fVar174 * fVar267 + fVar226 * fVar327);
      auVar42._8_4_ =
           (fVar234 + fVar234 * auVar20._8_4_) *
           -(fVar201 * fVar252 + fVar200 * fVar276 + fVar199 * fVar332);
      auVar42._12_4_ =
           (fVar249 + fVar249 * auVar20._12_4_) *
           -(fVar229 * fVar256 + fVar228 * fVar278 + fVar227 * fVar333);
      auVar42._16_4_ =
           (fVar253 + fVar253 * auVar20._16_4_) *
           -(fVar261 * fVar259 + fVar258 * fVar280 + fVar255 * fVar334);
      auVar42._20_4_ =
           (fVar257 + fVar257 * auVar20._20_4_) *
           -(fVar337 * fVar262 + fVar326 * fVar282 + fVar299 * fVar335);
      auVar42._24_4_ =
           (fVar260 + fVar260 * auVar20._24_4_) *
           -(fVar15 * fVar265 + fVar14 * fVar284 + fVar13 * fVar336);
      auVar42._28_4_ = -(fVar263 + auVar358._28_4_ + fVar263);
      auVar358 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar213 = vcmpps_avx(auVar124,auVar358,1);
      auVar213 = vorps_avx(auVar86,auVar213);
      auVar296._8_4_ = 0xff800000;
      auVar296._0_8_ = 0xff800000ff800000;
      auVar296._12_4_ = 0xff800000;
      auVar296._16_4_ = 0xff800000;
      auVar296._20_4_ = 0xff800000;
      auVar296._24_4_ = 0xff800000;
      auVar296._28_4_ = 0xff800000;
      auVar213 = vblendvps_avx(auVar42,auVar296,auVar213);
      auVar358 = vcmpps_avx(auVar124,auVar358,6);
      auVar86 = vorps_avx(auVar86,auVar358);
      auVar303._8_4_ = 0x7f800000;
      auVar303._0_8_ = 0x7f8000007f800000;
      auVar303._12_4_ = 0x7f800000;
      auVar303._16_4_ = 0x7f800000;
      auVar303._20_4_ = 0x7f800000;
      auVar303._24_4_ = 0x7f800000;
      auVar303._28_4_ = 0x7f800000;
      auVar86 = vblendvps_avx(auVar42,auVar303,auVar86);
      auVar358 = vmaxps_avx(local_300,local_c80);
      auVar358 = vmaxps_avx(auVar358,auVar213);
      auVar20 = vminps_avx(auVar359,auVar86);
      auVar359 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar213 = vsubps_avx(auVar359,_local_ac0);
      auVar86 = vsubps_avx(auVar359,_local_9c0);
      auVar43._4_4_ = auVar86._4_4_ * -fVar347;
      auVar43._0_4_ = auVar86._0_4_ * -fVar338;
      auVar43._8_4_ = auVar86._8_4_ * -fVar348;
      auVar43._12_4_ = auVar86._12_4_ * -fVar349;
      auVar43._16_4_ = auVar86._16_4_ * -fVar350;
      auVar43._20_4_ = auVar86._20_4_ * -fVar351;
      auVar43._24_4_ = auVar86._24_4_ * -fVar352;
      auVar43._28_4_ = auVar86._28_4_;
      auVar44._4_4_ = fVar254 * auVar213._4_4_;
      auVar44._0_4_ = fVar224 * auVar213._0_4_;
      auVar44._8_4_ = fVar197 * auVar213._8_4_;
      auVar44._12_4_ = fVar223 * auVar213._12_4_;
      auVar44._16_4_ = fVar247 * auVar213._16_4_;
      auVar44._20_4_ = fVar297 * auVar213._20_4_;
      auVar44._24_4_ = fVar11 * auVar213._24_4_;
      auVar44._28_4_ = auVar213._28_4_;
      auVar213 = vsubps_avx(auVar43,auVar44);
      auVar86 = vsubps_avx(auVar359,auVar142);
      auVar45._4_4_ = fVar175 * auVar86._4_4_;
      auVar45._0_4_ = fVar173 * auVar86._0_4_;
      auVar45._8_4_ = fVar198 * auVar86._8_4_;
      auVar45._12_4_ = fVar225 * auVar86._12_4_;
      auVar45._16_4_ = fVar251 * auVar86._16_4_;
      auVar45._20_4_ = fVar298 * auVar86._20_4_;
      uVar1 = auVar86._28_4_;
      auVar45._24_4_ = fVar12 * auVar86._24_4_;
      auVar45._28_4_ = uVar1;
      auVar142 = vsubps_avx(auVar213,auVar45);
      auVar46._4_4_ = (float)local_7a0._4_4_ * -fVar347;
      auVar46._0_4_ = (float)local_7a0._0_4_ * -fVar338;
      auVar46._8_4_ = fStack_798 * -fVar348;
      auVar46._12_4_ = fStack_794 * -fVar349;
      auVar46._16_4_ = fStack_790 * -fVar350;
      auVar46._20_4_ = fStack_78c * -fVar351;
      auVar46._24_4_ = fStack_788 * -fVar352;
      auVar46._28_4_ = uVar69 ^ 0x80000000;
      auVar47._4_4_ = (float)local_820._4_4_ * fVar254;
      auVar47._0_4_ = (float)local_820._0_4_ * fVar224;
      auVar47._8_4_ = fStack_818 * fVar197;
      auVar47._12_4_ = fStack_814 * fVar223;
      auVar47._16_4_ = fStack_810 * fVar247;
      auVar47._20_4_ = fStack_80c * fVar297;
      auVar47._24_4_ = fStack_808 * fVar11;
      auVar47._28_4_ = uVar1;
      auVar213 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar175 * (float)local_800._4_4_;
      auVar48._0_4_ = fVar173 * (float)local_800._0_4_;
      auVar48._8_4_ = fVar198 * fStack_7f8;
      auVar48._12_4_ = fVar225 * fStack_7f4;
      auVar48._16_4_ = fVar251 * fStack_7f0;
      auVar48._20_4_ = fVar298 * fStack_7ec;
      auVar48._24_4_ = fVar12 * fStack_7e8;
      auVar48._28_4_ = uVar1;
      auVar359 = vsubps_avx(auVar213,auVar48);
      auVar213 = vrcpps_avx(auVar359);
      fVar224 = auVar213._0_4_;
      fVar173 = auVar213._4_4_;
      auVar49._4_4_ = auVar359._4_4_ * fVar173;
      auVar49._0_4_ = auVar359._0_4_ * fVar224;
      fVar226 = auVar213._8_4_;
      auVar49._8_4_ = auVar359._8_4_ * fVar226;
      fVar174 = auVar213._12_4_;
      auVar49._12_4_ = auVar359._12_4_ * fVar174;
      fVar231 = auVar213._16_4_;
      auVar49._16_4_ = auVar359._16_4_ * fVar231;
      fVar254 = auVar213._20_4_;
      auVar49._20_4_ = auVar359._20_4_ * fVar254;
      fVar175 = auVar213._24_4_;
      auVar49._24_4_ = auVar359._24_4_ * fVar175;
      auVar49._28_4_ = fStack_7e4;
      auVar21 = vsubps_avx(auVar344,auVar49);
      auVar213 = vandps_avx(auVar359,auVar273);
      auVar274._8_4_ = 0x219392ef;
      auVar274._0_8_ = 0x219392ef219392ef;
      auVar274._12_4_ = 0x219392ef;
      auVar274._16_4_ = 0x219392ef;
      auVar274._20_4_ = 0x219392ef;
      auVar274._24_4_ = 0x219392ef;
      auVar274._28_4_ = 0x219392ef;
      auVar86 = vcmpps_avx(auVar213,auVar274,1);
      auVar50._4_4_ = (fVar173 + fVar173 * auVar21._4_4_) * -auVar142._4_4_;
      auVar50._0_4_ = (fVar224 + fVar224 * auVar21._0_4_) * -auVar142._0_4_;
      auVar50._8_4_ = (fVar226 + fVar226 * auVar21._8_4_) * -auVar142._8_4_;
      auVar50._12_4_ = (fVar174 + fVar174 * auVar21._12_4_) * -auVar142._12_4_;
      auVar50._16_4_ = (fVar231 + fVar231 * auVar21._16_4_) * -auVar142._16_4_;
      auVar50._20_4_ = (fVar254 + fVar254 * auVar21._20_4_) * -auVar142._20_4_;
      auVar50._24_4_ = (fVar175 + fVar175 * auVar21._24_4_) * -auVar142._24_4_;
      auVar50._28_4_ = auVar142._28_4_ ^ 0x80000000;
      auVar213 = vcmpps_avx(auVar359,ZEXT832(0) << 0x20,1);
      auVar213 = vorps_avx(auVar86,auVar213);
      auVar213 = vblendvps_avx(auVar50,auVar296,auVar213);
      _local_a80 = vmaxps_avx(auVar358,auVar213);
      auVar213 = vcmpps_avx(auVar359,ZEXT832(0) << 0x20,6);
      auVar213 = vorps_avx(auVar86,auVar213);
      auVar213 = vblendvps_avx(auVar50,auVar303,auVar213);
      auVar85 = vandps_avx(auVar85,local_400);
      local_380 = vminps_avx(auVar20,auVar213);
      auVar213 = vcmpps_avx(_local_a80,local_380,2);
      auVar86 = auVar85 & auVar213;
      if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar86 >> 0x7f,0) != '\0') ||
            (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar86 >> 0xbf,0) != '\0') ||
          (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar86[0x1f] < '\0') {
        auVar86 = vminps_avx(auVar290,auVar87);
        auVar123 = vminps_avx(auVar123,auVar19);
        auVar86 = vminps_avx(auVar86,auVar123);
        auVar86 = vsubps_avx(auVar86,auVar291);
        auVar85 = vandps_avx(auVar213,auVar85);
        auVar213 = vminps_avx(_local_9e0,auVar344);
        auVar213 = vmaxps_avx(auVar213,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar73 + fVar109 * (auVar213._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar100 + fVar131 * (auVar213._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar102 + fVar132 * (auVar213._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar104 + fVar133 * (auVar213._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar73 + fVar109 * (auVar213._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar100 + fVar131 * (auVar213._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar102 + fVar132 * (auVar213._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar104 + auVar213._28_4_ + 7.0;
        auVar62._4_4_ = fStack_31c;
        auVar62._0_4_ = local_320;
        auVar62._8_4_ = fStack_318;
        auVar62._12_4_ = fStack_314;
        auVar62._16_4_ = fStack_310;
        auVar62._20_4_ = fStack_30c;
        auVar62._24_4_ = fStack_308;
        auVar62._28_4_ = fStack_304;
        auVar213 = vminps_avx(auVar62,auVar344);
        auVar213 = vmaxps_avx(auVar213,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar73 + fVar109 * (auVar213._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar100 + fVar131 * (auVar213._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar102 + fVar132 * (auVar213._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar104 + fVar133 * (auVar213._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar73 + fVar109 * (auVar213._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar100 + fVar131 * (auVar213._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar102 + fVar132 * (auVar213._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar104 + auVar213._28_4_ + 7.0;
        auVar51._4_4_ = auVar86._4_4_ * 0.99999976;
        auVar51._0_4_ = auVar86._0_4_ * 0.99999976;
        auVar51._8_4_ = auVar86._8_4_ * 0.99999976;
        auVar51._12_4_ = auVar86._12_4_ * 0.99999976;
        auVar51._16_4_ = auVar86._16_4_ * 0.99999976;
        auVar51._20_4_ = auVar86._20_4_ * 0.99999976;
        auVar51._24_4_ = auVar86._24_4_ * 0.99999976;
        auVar51._28_4_ = 0x3f7ffffc;
        auVar213 = vmaxps_avx(ZEXT832(0) << 0x20,auVar51);
        auVar52._4_4_ = auVar213._4_4_ * auVar213._4_4_;
        auVar52._0_4_ = auVar213._0_4_ * auVar213._0_4_;
        auVar52._8_4_ = auVar213._8_4_ * auVar213._8_4_;
        auVar52._12_4_ = auVar213._12_4_ * auVar213._12_4_;
        auVar52._16_4_ = auVar213._16_4_ * auVar213._16_4_;
        auVar52._20_4_ = auVar213._20_4_ * auVar213._20_4_;
        auVar52._24_4_ = auVar213._24_4_ * auVar213._24_4_;
        auVar52._28_4_ = auVar213._28_4_;
        local_8c0 = vsubps_avx(auVar22,auVar52);
        auVar53._4_4_ = local_8c0._4_4_ * fVar106 * 4.0;
        auVar53._0_4_ = local_8c0._0_4_ * fVar105 * 4.0;
        auVar53._8_4_ = local_8c0._8_4_ * fVar107 * 4.0;
        auVar53._12_4_ = local_8c0._12_4_ * fVar108 * 4.0;
        auVar53._16_4_ = local_8c0._16_4_ * fVar308 * 4.0;
        auVar53._20_4_ = local_8c0._20_4_ * fVar310 * 4.0;
        auVar53._24_4_ = local_8c0._24_4_ * fVar312 * 4.0;
        auVar53._28_4_ = auVar213._28_4_;
        auVar86 = vsubps_avx(auVar35,auVar53);
        auVar213 = vcmpps_avx(auVar86,ZEXT832(0) << 0x20,5);
        if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar213 >> 0x7f,0) == '\0') &&
              (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar213 >> 0xbf,0) == '\0') &&
            (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar213[0x1f]) {
          auVar142 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          _local_720 = ZEXT832(0) << 0x20;
          auVar191 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar217._8_4_ = 0x7f800000;
          auVar217._0_8_ = 0x7f8000007f800000;
          auVar217._12_4_ = 0x7f800000;
          auVar217._16_4_ = 0x7f800000;
          auVar217._20_4_ = 0x7f800000;
          auVar217._24_4_ = 0x7f800000;
          auVar217._28_4_ = 0x7f800000;
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          fVar152 = 0.0;
          fVar222 = 0.0;
          fVar172 = 0.0;
          fVar224 = 0.0;
          fVar173 = 0.0;
          fVar226 = 0.0;
          fVar174 = 0.0;
          fVar231 = 0.0;
          local_8c0 = auVar25;
          _local_860 = _local_880;
        }
        else {
          auVar142 = vsqrtps_avx(auVar86);
          auVar169._0_4_ = fVar105 + fVar105;
          auVar169._4_4_ = fVar106 + fVar106;
          auVar169._8_4_ = fVar107 + fVar107;
          auVar169._12_4_ = fVar108 + fVar108;
          auVar169._16_4_ = fVar308 + fVar308;
          auVar169._20_4_ = fVar310 + fVar310;
          auVar169._24_4_ = fVar312 + fVar312;
          auVar169._28_4_ = fVar152 + fVar152;
          auVar123 = vrcpps_avx(auVar169);
          fVar152 = auVar123._0_4_;
          fVar224 = auVar123._4_4_;
          auVar54._4_4_ = auVar169._4_4_ * fVar224;
          auVar54._0_4_ = auVar169._0_4_ * fVar152;
          fVar173 = auVar123._8_4_;
          auVar54._8_4_ = auVar169._8_4_ * fVar173;
          fVar226 = auVar123._12_4_;
          auVar54._12_4_ = auVar169._12_4_ * fVar226;
          fVar174 = auVar123._16_4_;
          auVar54._16_4_ = auVar169._16_4_ * fVar174;
          fVar231 = auVar123._20_4_;
          auVar54._20_4_ = auVar169._20_4_ * fVar231;
          fVar254 = auVar123._24_4_;
          auVar54._24_4_ = auVar169._24_4_ * fVar254;
          auVar54._28_4_ = auVar169._28_4_;
          auVar19 = vsubps_avx(auVar344,auVar54);
          fVar152 = fVar152 + fVar152 * auVar19._0_4_;
          fVar224 = fVar224 + fVar224 * auVar19._4_4_;
          fVar173 = fVar173 + fVar173 * auVar19._8_4_;
          fVar226 = fVar226 + fVar226 * auVar19._12_4_;
          fVar174 = fVar174 + fVar174 * auVar19._16_4_;
          fVar231 = fVar231 + fVar231 * auVar19._20_4_;
          fVar254 = fVar254 + fVar254 * auVar19._24_4_;
          fVar175 = auVar123._28_4_ + auVar19._28_4_;
          auVar193._0_8_ = local_920._0_8_ ^ 0x8000000080000000;
          auVar193._8_4_ = -local_920._8_4_;
          auVar193._12_4_ = -local_920._12_4_;
          auVar193._16_4_ = -local_920._16_4_;
          auVar193._20_4_ = -local_920._20_4_;
          auVar193._24_4_ = -local_920._24_4_;
          auVar193._28_4_ = -local_920._28_4_;
          auVar123 = vsubps_avx(auVar193,auVar142);
          fVar176 = auVar123._0_4_ * fVar152;
          fVar177 = auVar123._4_4_ * fVar224;
          auVar55._4_4_ = fVar177;
          auVar55._0_4_ = fVar176;
          fVar178 = auVar123._8_4_ * fVar173;
          auVar55._8_4_ = fVar178;
          fVar197 = auVar123._12_4_ * fVar226;
          auVar55._12_4_ = fVar197;
          fVar198 = auVar123._16_4_ * fVar174;
          auVar55._16_4_ = fVar198;
          fVar199 = auVar123._20_4_ * fVar231;
          auVar55._20_4_ = fVar199;
          fVar200 = auVar123._24_4_ * fVar254;
          auVar55._24_4_ = fVar200;
          auVar55._28_4_ = local_740._28_4_;
          auVar142 = vsubps_avx(auVar142,local_920);
          auVar329._0_4_ = auVar142._0_4_ * fVar152;
          auVar329._4_4_ = auVar142._4_4_ * fVar224;
          auVar329._8_4_ = auVar142._8_4_ * fVar173;
          auVar329._12_4_ = auVar142._12_4_ * fVar226;
          auVar329._16_4_ = auVar142._16_4_ * fVar174;
          auVar329._20_4_ = auVar142._20_4_ * fVar231;
          auVar329._24_4_ = auVar142._24_4_ * fVar254;
          auVar329._28_4_ = 0;
          fVar152 = local_340 * (fVar176 * fVar300 + local_9a0);
          fVar224 = fStack_33c * (fVar177 * fVar304 + fStack_99c);
          fVar173 = fStack_338 * (fVar178 * fVar305 + fStack_998);
          fVar226 = fStack_334 * (fVar197 * fVar306 + fStack_994);
          fVar174 = fStack_330 * (fVar198 * fVar307 + fStack_990);
          fVar231 = fStack_32c * (fVar199 * fVar309 + fStack_98c);
          fVar254 = fStack_328 * (fVar200 * fVar311 + fStack_988);
          auStack_6f0._12_4_ = auVar168._28_4_;
          auVar143._0_4_ = auVar341._0_4_ + fVar172 * fVar152;
          auVar143._4_4_ = auVar341._4_4_ + fVar250 * fVar224;
          auVar143._8_4_ = auVar341._8_4_ + fVar180 * fVar173;
          auVar143._12_4_ = auVar341._12_4_ + fVar204 * fVar226;
          auVar143._16_4_ = auVar341._16_4_ + fVar232 * fVar174;
          auVar143._20_4_ = auVar341._20_4_ + fVar286 * fVar231;
          auVar143._24_4_ = auVar341._24_4_ + fVar10 * fVar254;
          auVar143._28_4_ = auVar341._28_4_ + auVar142._28_4_ + fStack_984;
          auVar56._4_4_ = fVar177 * (float)local_800._4_4_;
          auVar56._0_4_ = fVar176 * (float)local_800._0_4_;
          auVar56._8_4_ = fVar178 * fStack_7f8;
          auVar56._12_4_ = fVar197 * fStack_7f4;
          auVar56._16_4_ = fVar198 * fStack_7f0;
          auVar56._20_4_ = fVar199 * fStack_7ec;
          auVar56._24_4_ = fVar200 * fStack_7e8;
          auVar56._28_4_ = fVar175;
          _local_ac0 = vsubps_avx(auVar56,auVar143);
          auVar170._0_4_ = auVar354._0_4_ + fVar222 * fVar152;
          auVar170._4_4_ = auVar354._4_4_ + fVar246 * fVar224;
          auVar170._8_4_ = auVar354._8_4_ + fVar179 * fVar173;
          auVar170._12_4_ = auVar354._12_4_ + fVar202 * fVar226;
          auVar170._16_4_ = auVar354._16_4_ + fVar230 * fVar174;
          auVar170._20_4_ = auVar354._20_4_ + fVar264 * fVar231;
          auVar170._24_4_ = auVar354._24_4_ + fVar353 * fVar254;
          auVar170._28_4_ = auVar354._28_4_ + fVar175;
          auVar218._0_4_ = (float)local_820._0_4_ * fVar176;
          auVar218._4_4_ = (float)local_820._4_4_ * fVar177;
          auVar218._8_4_ = fStack_818 * fVar178;
          auVar218._12_4_ = fStack_814 * fVar197;
          auVar218._16_4_ = fStack_810 * fVar198;
          auVar218._20_4_ = fStack_80c * fVar199;
          auVar218._24_4_ = fStack_808 * fVar200;
          auVar218._28_4_ = 0;
          auVar142 = vsubps_avx(auVar218,auVar170);
          auVar194._0_4_ = auVar362._0_4_ + fVar317 * fVar152;
          auVar194._4_4_ = auVar362._4_4_ + fVar320 * fVar224;
          auVar194._8_4_ = auVar362._8_4_ + fVar321 * fVar173;
          auVar194._12_4_ = auVar362._12_4_ + fVar322 * fVar226;
          auVar194._16_4_ = auVar362._16_4_ + fVar323 * fVar174;
          auVar194._20_4_ = auVar362._20_4_ + fVar324 * fVar231;
          auVar194._24_4_ = auVar362._24_4_ + fVar325 * fVar254;
          auVar194._28_4_ = auVar362._28_4_ + auVar123._28_4_;
          auVar57._4_4_ = (float)local_7a0._4_4_ * fVar177;
          auVar57._0_4_ = (float)local_7a0._0_4_ * fVar176;
          auVar57._8_4_ = fStack_798 * fVar178;
          auVar57._12_4_ = fStack_794 * fVar197;
          auVar57._16_4_ = fStack_790 * fVar198;
          auVar57._20_4_ = fStack_78c * fVar199;
          auVar57._24_4_ = fStack_788 * fVar200;
          auVar57._28_4_ = 0;
          auVar123 = vsubps_avx(auVar57,auVar194);
          auVar191 = auVar123._0_28_;
          fVar152 = local_340 * (auVar329._0_4_ * fVar300 + local_9a0);
          fVar224 = fStack_33c * (auVar329._4_4_ * fVar304 + fStack_99c);
          fVar173 = fStack_338 * (auVar329._8_4_ * fVar305 + fStack_998);
          fVar226 = fStack_334 * (auVar329._12_4_ * fVar306 + fStack_994);
          fVar174 = fStack_330 * (auVar329._16_4_ * fVar307 + fStack_990);
          fVar231 = fStack_32c * (auVar329._20_4_ * fVar309 + fStack_98c);
          fVar254 = fStack_328 * (auVar329._24_4_ * fVar311 + fStack_988);
          auVar242._0_4_ = auVar341._0_4_ + fVar172 * fVar152;
          auVar242._4_4_ = auVar341._4_4_ + fVar250 * fVar224;
          auVar242._8_4_ = auVar341._8_4_ + fVar180 * fVar173;
          auVar242._12_4_ = auVar341._12_4_ + fVar204 * fVar226;
          auVar242._16_4_ = auVar341._16_4_ + fVar232 * fVar174;
          auVar242._20_4_ = auVar341._20_4_ + fVar286 * fVar231;
          auVar242._24_4_ = auVar341._24_4_ + fVar10 * fVar254;
          auVar242._28_4_ = auVar341._28_4_ + (float)auStack_6f0._12_4_;
          auVar58._4_4_ = auVar329._4_4_ * (float)local_800._4_4_;
          auVar58._0_4_ = auVar329._0_4_ * (float)local_800._0_4_;
          auVar58._8_4_ = auVar329._8_4_ * fStack_7f8;
          auVar58._12_4_ = auVar329._12_4_ * fStack_7f4;
          auVar58._16_4_ = auVar329._16_4_ * fStack_7f0;
          auVar58._20_4_ = auVar329._20_4_ * fStack_7ec;
          auVar58._24_4_ = auVar329._24_4_ * fStack_7e8;
          auVar58._28_4_ = fStack_7e4;
          _local_860 = vsubps_avx(auVar58,auVar242);
          auVar243._0_4_ = auVar354._0_4_ + fVar222 * fVar152;
          auVar243._4_4_ = auVar354._4_4_ + fVar246 * fVar224;
          auVar243._8_4_ = auVar354._8_4_ + fVar179 * fVar173;
          auVar243._12_4_ = auVar354._12_4_ + fVar202 * fVar226;
          auVar243._16_4_ = auVar354._16_4_ + fVar230 * fVar174;
          auVar243._20_4_ = auVar354._20_4_ + fVar264 * fVar231;
          auVar243._24_4_ = auVar354._24_4_ + fVar353 * fVar254;
          auVar243._28_4_ = auVar354._28_4_ + local_860._28_4_;
          auVar59._4_4_ = (float)local_820._4_4_ * auVar329._4_4_;
          auVar59._0_4_ = (float)local_820._0_4_ * auVar329._0_4_;
          auVar59._8_4_ = fStack_818 * auVar329._8_4_;
          auVar59._12_4_ = fStack_814 * auVar329._12_4_;
          auVar59._16_4_ = fStack_810 * auVar329._16_4_;
          auVar59._20_4_ = fStack_80c * auVar329._20_4_;
          auVar59._24_4_ = fStack_808 * auVar329._24_4_;
          auVar59._28_4_ = fStack_7e4;
          _local_880 = vsubps_avx(auVar59,auVar243);
          auVar219._0_4_ = auVar362._0_4_ + fVar317 * fVar152;
          auVar219._4_4_ = auVar362._4_4_ + fVar320 * fVar224;
          auVar219._8_4_ = auVar362._8_4_ + fVar321 * fVar173;
          auVar219._12_4_ = auVar362._12_4_ + fVar322 * fVar226;
          auVar219._16_4_ = auVar362._16_4_ + fVar323 * fVar174;
          auVar219._20_4_ = auVar362._20_4_ + fVar324 * fVar231;
          auVar219._24_4_ = auVar362._24_4_ + fVar325 * fVar254;
          auVar219._28_4_ = auVar362._28_4_ + fStack_984 + 0.0;
          auVar60._4_4_ = (float)local_7a0._4_4_ * auVar329._4_4_;
          auVar60._0_4_ = (float)local_7a0._0_4_ * auVar329._0_4_;
          auVar60._8_4_ = fStack_798 * auVar329._8_4_;
          auVar60._12_4_ = fStack_794 * auVar329._12_4_;
          auVar60._16_4_ = fStack_790 * auVar329._16_4_;
          auVar60._20_4_ = fStack_78c * auVar329._20_4_;
          auVar60._24_4_ = fStack_788 * auVar329._24_4_;
          auVar60._28_4_ = local_880._28_4_;
          _local_720 = vsubps_avx(auVar60,auVar219);
          auVar123 = vcmpps_avx(auVar86,_DAT_01faff00,5);
          auVar220._8_4_ = 0x7f800000;
          auVar220._0_8_ = 0x7f8000007f800000;
          auVar220._12_4_ = 0x7f800000;
          auVar220._16_4_ = 0x7f800000;
          auVar220._20_4_ = 0x7f800000;
          auVar220._24_4_ = 0x7f800000;
          auVar220._28_4_ = 0x7f800000;
          auVar217 = vblendvps_avx(auVar220,auVar55,auVar123);
          auVar315._8_4_ = 0x7fffffff;
          auVar315._0_8_ = 0x7fffffff7fffffff;
          auVar315._12_4_ = 0x7fffffff;
          auVar315._16_4_ = 0x7fffffff;
          auVar315._20_4_ = 0x7fffffff;
          auVar315._24_4_ = 0x7fffffff;
          auVar315._28_4_ = 0x7fffffff;
          auVar86 = vandps_avx(auVar315,local_360);
          auVar86 = vmaxps_avx(local_440,auVar86);
          auVar61._4_4_ = auVar86._4_4_ * 1.9073486e-06;
          auVar61._0_4_ = auVar86._0_4_ * 1.9073486e-06;
          auVar61._8_4_ = auVar86._8_4_ * 1.9073486e-06;
          auVar61._12_4_ = auVar86._12_4_ * 1.9073486e-06;
          auVar61._16_4_ = auVar86._16_4_ * 1.9073486e-06;
          auVar61._20_4_ = auVar86._20_4_ * 1.9073486e-06;
          auVar61._24_4_ = auVar86._24_4_ * 1.9073486e-06;
          auVar61._28_4_ = auVar86._28_4_;
          auVar86 = vandps_avx(auVar315,local_4a0);
          auVar86 = vcmpps_avx(auVar86,auVar61,1);
          auVar244._8_4_ = 0xff800000;
          auVar244._0_8_ = 0xff800000ff800000;
          auVar244._12_4_ = 0xff800000;
          auVar244._16_4_ = 0xff800000;
          auVar244._20_4_ = 0xff800000;
          auVar244._24_4_ = 0xff800000;
          auVar244._28_4_ = 0xff800000;
          auVar241 = vblendvps_avx(auVar244,auVar329,auVar123);
          auVar19 = auVar123 & auVar86;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            auVar213 = vandps_avx(auVar86,auVar123);
            auVar208 = vpackssdw_avx(auVar213._0_16_,auVar213._16_16_);
            auVar19 = vcmpps_avx(local_8c0,ZEXT832(0) << 0x20,2);
            auVar360._8_4_ = 0xff800000;
            auVar360._0_8_ = 0xff800000ff800000;
            auVar360._12_4_ = 0xff800000;
            auVar360._16_4_ = 0xff800000;
            auVar360._20_4_ = 0xff800000;
            auVar360._24_4_ = 0xff800000;
            auVar360._28_4_ = 0xff800000;
            auVar364._8_4_ = 0x7f800000;
            auVar364._0_8_ = 0x7f8000007f800000;
            auVar364._12_4_ = 0x7f800000;
            auVar364._16_4_ = 0x7f800000;
            auVar364._20_4_ = 0x7f800000;
            auVar364._24_4_ = 0x7f800000;
            auVar364._28_4_ = 0x7f800000;
            auVar86 = vblendvps_avx(auVar364,auVar360,auVar19);
            auVar165 = vpmovsxwd_avx(auVar208);
            auVar208 = vpunpckhwd_avx(auVar208,auVar208);
            auVar316._16_16_ = auVar208;
            auVar316._0_16_ = auVar165;
            auVar217 = vblendvps_avx(auVar217,auVar86,auVar316);
            auVar86 = vblendvps_avx(auVar360,auVar364,auVar19);
            auVar241 = vblendvps_avx(auVar241,auVar86,auVar316);
            auVar86 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar99._0_4_ = auVar86._0_4_ ^ auVar213._0_4_;
            auVar99._4_4_ = auVar86._4_4_ ^ auVar213._4_4_;
            auVar99._8_4_ = auVar86._8_4_ ^ auVar213._8_4_;
            auVar99._12_4_ = auVar86._12_4_ ^ auVar213._12_4_;
            auVar99._16_4_ = auVar86._16_4_ ^ auVar213._16_4_;
            auVar99._20_4_ = auVar86._20_4_ ^ auVar213._20_4_;
            auVar99._24_4_ = auVar86._24_4_ ^ auVar213._24_4_;
            auVar99._28_4_ = auVar86._28_4_ ^ auVar213._28_4_;
            auVar213 = vorps_avx(auVar19,auVar99);
            auVar213 = vandps_avx(auVar123,auVar213);
          }
          fVar152 = (float)local_ac0._0_4_;
          fVar222 = (float)local_ac0._4_4_;
          fVar172 = fStack_ab8;
          fVar224 = fStack_ab4;
          fVar173 = fStack_ab0;
          fVar226 = fStack_aac;
          fVar174 = fStack_aa8;
          fVar231 = fStack_aa4;
          _local_9c0 = auVar142;
        }
        _local_3e0 = _local_a80;
        local_3c0 = vminps_avx(local_380,auVar217);
        _local_7e0 = vmaxps_avx(_local_a80,auVar241);
        local_3a0 = _local_7e0;
        auVar86 = vcmpps_avx(_local_a80,local_3c0,2);
        local_660 = vandps_avx(auVar85,auVar86);
        auVar86 = vcmpps_avx(_local_7e0,local_380,2);
        local_6a0 = vandps_avx(auVar85,auVar86);
        auVar85 = vorps_avx(local_6a0,local_660);
        if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0x7f,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0xbf,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar85[0x1f] < '\0') {
          _local_9e0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6c0._0_4_ = auVar213._0_4_ ^ local_9e0._0_4_;
          local_6c0._4_4_ = auVar213._4_4_ ^ local_9e0._4_4_;
          local_6c0._8_4_ = auVar213._8_4_ ^ local_9e0._8_4_;
          local_6c0._12_4_ = auVar213._12_4_ ^ local_9e0._12_4_;
          local_6c0._16_4_ = auVar213._16_4_ ^ local_9e0._16_4_;
          local_6c0._20_4_ = auVar213._20_4_ ^ local_9e0._20_4_;
          local_6c0._24_4_ = auVar213._24_4_ ^ local_9e0._24_4_;
          local_6c0._28_4_ = auVar213._28_4_ ^ (uint)local_9e0._28_4_;
          auVar90._0_4_ =
               fVar152 * (float)local_800._0_4_ +
               auVar142._0_4_ * (float)local_820._0_4_ + (float)local_7a0._0_4_ * auVar191._0_4_;
          auVar90._4_4_ =
               fVar222 * (float)local_800._4_4_ +
               auVar142._4_4_ * (float)local_820._4_4_ + (float)local_7a0._4_4_ * auVar191._4_4_;
          auVar90._8_4_ =
               fVar172 * fStack_7f8 + auVar142._8_4_ * fStack_818 + fStack_798 * auVar191._8_4_;
          auVar90._12_4_ =
               fVar224 * fStack_7f4 + auVar142._12_4_ * fStack_814 + fStack_794 * auVar191._12_4_;
          auVar90._16_4_ =
               fVar173 * fStack_7f0 + auVar142._16_4_ * fStack_810 + fStack_790 * auVar191._16_4_;
          auVar90._20_4_ =
               fVar226 * fStack_7ec + auVar142._20_4_ * fStack_80c + fStack_78c * auVar191._20_4_;
          auVar90._24_4_ =
               fVar174 * fStack_7e8 + auVar142._24_4_ * fStack_808 + fStack_788 * auVar191._24_4_;
          auVar90._28_4_ = fVar231 + local_9e0._28_4_ + auVar142._28_4_;
          auVar126._8_4_ = 0x7fffffff;
          auVar126._0_8_ = 0x7fffffff7fffffff;
          auVar126._12_4_ = 0x7fffffff;
          auVar126._16_4_ = 0x7fffffff;
          auVar126._20_4_ = 0x7fffffff;
          auVar126._24_4_ = 0x7fffffff;
          auVar126._28_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar90,auVar126);
          auVar127._8_4_ = 0x3e99999a;
          auVar127._0_8_ = 0x3e99999a3e99999a;
          auVar127._12_4_ = 0x3e99999a;
          auVar127._16_4_ = 0x3e99999a;
          auVar127._20_4_ = 0x3e99999a;
          auVar127._24_4_ = 0x3e99999a;
          auVar127._28_4_ = 0x3e99999a;
          auVar85 = vcmpps_avx(auVar85,auVar127,1);
          auVar85 = vorps_avx(auVar85,local_6c0);
          auVar128._8_4_ = 3;
          auVar128._0_8_ = 0x300000003;
          auVar128._12_4_ = 3;
          auVar128._16_4_ = 3;
          auVar128._20_4_ = 3;
          auVar128._24_4_ = 3;
          auVar128._28_4_ = 3;
          auVar144._8_4_ = 2;
          auVar144._0_8_ = 0x200000002;
          auVar144._12_4_ = 2;
          auVar144._16_4_ = 2;
          auVar144._20_4_ = 2;
          auVar144._24_4_ = 2;
          auVar144._28_4_ = 2;
          auVar85 = vblendvps_avx(auVar144,auVar128,auVar85);
          local_6e0 = ZEXT432(local_ca8);
          local_700 = vpshufd_avx(ZEXT416(local_ca8),0);
          auVar208 = vpcmpgtd_avx(auVar85._16_16_,local_700);
          auStack_6f0 = auVar168._16_16_;
          auVar165 = vpcmpgtd_avx(auVar85._0_16_,local_700);
          auVar129._16_16_ = auVar208;
          auVar129._0_16_ = auVar165;
          local_680 = vblendps_avx(ZEXT1632(auVar165),auVar129,0xf0);
          local_620 = vandnps_avx(local_680,local_660);
          auVar319 = ZEXT3264(local_620);
          auVar85 = local_660 & ~local_680;
          auVar245 = ZEXT3264(local_aa0);
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar85 >> 0x7f,0) == '\0') &&
                (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar85 >> 0xbf,0) == '\0') &&
              (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar85[0x1f]) {
            auVar208 = vshufps_avx(local_5f0,local_5f0,0);
            auVar91._16_16_ = auVar208;
            auVar91._0_16_ = auVar208;
            auVar191 = local_800._0_28_;
          }
          else {
            local_7c0._4_4_ = (float)local_a80._4_4_ + local_8e0._4_4_;
            local_7c0._0_4_ = (float)local_a80._0_4_ + (float)local_8e0;
            fStack_7b8 = fStack_a78 + (float)uStack_8d8;
            fStack_7b4 = fStack_a74 + uStack_8d8._4_4_;
            fStack_7b0 = fStack_a70 + (float)uStack_8d0;
            fStack_7ac = fStack_a6c + uStack_8d0._4_4_;
            fStack_7a8 = fStack_a68 + (float)uStack_8c8;
            fStack_7a4 = fStack_a64 + uStack_8c8._4_4_;
            do {
              auVar92._8_4_ = 0x7f800000;
              auVar92._0_8_ = 0x7f8000007f800000;
              auVar92._12_4_ = 0x7f800000;
              auVar92._16_4_ = 0x7f800000;
              auVar92._20_4_ = 0x7f800000;
              auVar92._24_4_ = 0x7f800000;
              auVar92._28_4_ = 0x7f800000;
              auVar85 = auVar319._0_32_;
              auVar213 = vblendvps_avx(auVar92,_local_a80,auVar85);
              auVar86 = vshufps_avx(auVar213,auVar213,0xb1);
              auVar86 = vminps_avx(auVar213,auVar86);
              auVar123 = vshufpd_avx(auVar86,auVar86,5);
              auVar86 = vminps_avx(auVar86,auVar123);
              auVar123 = vperm2f128_avx(auVar86,auVar86,1);
              auVar86 = vminps_avx(auVar86,auVar123);
              auVar213 = vcmpps_avx(auVar213,auVar86,0);
              auVar86 = auVar85 & auVar213;
              if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar86 >> 0x7f,0) != '\0') ||
                    (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar86 >> 0xbf,0) != '\0') ||
                  (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar86[0x1f] < '\0') {
                auVar85 = vandps_avx(auVar213,auVar85);
              }
              uVar64 = vmovmskps_avx(auVar85);
              uVar69 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
              uVar66 = (ulong)uVar69;
              *(undefined4 *)(local_620 + uVar66 * 4) = 0;
              fVar152 = local_1a0[uVar66];
              uVar69 = *(uint *)(local_3e0 + uVar66 * 4);
              fVar222 = auVar112._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar222 = sqrtf((float)local_940._0_4_);
              }
              auVar165 = vminps_avx(_local_b00,_local_b20);
              auVar208 = vmaxps_avx(_local_b00,_local_b20);
              auVar75 = vminps_avx(_local_b10,_local_b30);
              auVar81 = vminps_avx(auVar165,auVar75);
              auVar165 = vmaxps_avx(_local_b10,_local_b30);
              auVar75 = vmaxps_avx(auVar208,auVar165);
              auVar155._8_4_ = 0x7fffffff;
              auVar155._0_8_ = 0x7fffffff7fffffff;
              auVar155._12_4_ = 0x7fffffff;
              auVar208 = vandps_avx(auVar81,auVar155);
              auVar165 = vandps_avx(auVar75,auVar155);
              auVar208 = vmaxps_avx(auVar208,auVar165);
              auVar165 = vmovshdup_avx(auVar208);
              auVar165 = vmaxss_avx(auVar165,auVar208);
              auVar208 = vshufpd_avx(auVar208,auVar208,1);
              auVar208 = vmaxss_avx(auVar208,auVar165);
              local_ac0._0_4_ = auVar208._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar222 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar75,auVar75,0xff);
              auVar208 = vinsertps_avx(ZEXT416(uVar69),ZEXT416((uint)fVar152),0x10);
              lVar68 = 5;
              do {
                auVar165 = vmovshdup_avx(auVar208);
                fVar177 = auVar165._0_4_;
                fVar173 = 1.0 - fVar177;
                auVar165 = vshufps_avx(auVar208,auVar208,0x55);
                fVar152 = auVar165._0_4_;
                fVar222 = auVar165._4_4_;
                fVar172 = auVar165._8_4_;
                fVar224 = auVar165._12_4_;
                auVar165 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
                fVar226 = auVar165._0_4_;
                fVar174 = auVar165._4_4_;
                fVar231 = auVar165._8_4_;
                fVar246 = auVar165._12_4_;
                fVar250 = (float)local_b10._0_4_ * fVar152 + (float)local_b20._0_4_ * fVar226;
                fVar254 = (float)local_b10._4_4_ * fVar222 + (float)local_b20._4_4_ * fVar174;
                fVar175 = fStack_b08 * fVar172 + fStack_b18 * fVar231;
                fVar176 = fStack_b04 * fVar224 + fStack_b14 * fVar246;
                auVar209._0_4_ =
                     fVar226 * ((float)local_b20._0_4_ * fVar152 + fVar226 * (float)local_b00._0_4_)
                     + fVar152 * fVar250;
                auVar209._4_4_ =
                     fVar174 * ((float)local_b20._4_4_ * fVar222 + fVar174 * (float)local_b00._4_4_)
                     + fVar222 * fVar254;
                auVar209._8_4_ =
                     fVar231 * (fStack_b18 * fVar172 + fVar231 * fStack_af8) + fVar172 * fVar175;
                auVar209._12_4_ =
                     fVar246 * (fStack_b14 * fVar224 + fVar246 * fStack_af4) + fVar224 * fVar176;
                auVar156._0_4_ =
                     fVar226 * fVar250 +
                     fVar152 * (fVar152 * (float)local_b30._0_4_ + (float)local_b10._0_4_ * fVar226)
                ;
                auVar156._4_4_ =
                     fVar174 * fVar254 +
                     fVar222 * (fVar222 * (float)local_b30._4_4_ + (float)local_b10._4_4_ * fVar174)
                ;
                auVar156._8_4_ =
                     fVar231 * fVar175 + fVar172 * (fVar172 * fStack_b28 + fStack_b08 * fVar231);
                auVar156._12_4_ =
                     fVar246 * fVar176 + fVar224 * (fVar224 * fStack_b24 + fStack_b04 * fVar246);
                auVar165 = vshufps_avx(auVar208,auVar208,0);
                auVar113._0_4_ = auVar165._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar113._4_4_ = auVar165._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar113._8_4_ = auVar165._8_4_ * fStack_928 + 0.0;
                auVar113._12_4_ = auVar165._12_4_ * fStack_924 + 0.0;
                auVar78._0_4_ = fVar226 * auVar209._0_4_ + fVar152 * auVar156._0_4_;
                auVar78._4_4_ = fVar174 * auVar209._4_4_ + fVar222 * auVar156._4_4_;
                auVar78._8_4_ = fVar231 * auVar209._8_4_ + fVar172 * auVar156._8_4_;
                auVar78._12_4_ = fVar246 * auVar209._12_4_ + fVar224 * auVar156._12_4_;
                local_8c0._0_16_ = auVar78;
                auVar165 = vsubps_avx(auVar113,auVar78);
                _local_9c0 = auVar165;
                auVar165 = vdpps_avx(auVar165,auVar165,0x7f);
                fVar152 = auVar165._0_4_;
                if (fVar152 < 0.0) {
                  fVar222 = sqrtf(fVar152);
                }
                else {
                  auVar75 = vsqrtss_avx(auVar165,auVar165);
                  fVar222 = auVar75._0_4_;
                }
                auVar75 = vsubps_avx(auVar156,auVar209);
                auVar236._0_4_ = auVar75._0_4_ * 3.0;
                auVar236._4_4_ = auVar75._4_4_ * 3.0;
                auVar236._8_4_ = auVar75._8_4_ * 3.0;
                auVar236._12_4_ = auVar75._12_4_ * 3.0;
                auVar75 = vshufps_avx(ZEXT416((uint)(fVar177 * 6.0)),ZEXT416((uint)(fVar177 * 6.0)),
                                      0);
                auVar81 = ZEXT416((uint)((fVar173 - (fVar177 + fVar177)) * 6.0));
                auVar111 = vshufps_avx(auVar81,auVar81,0);
                auVar81 = ZEXT416((uint)((fVar177 - (fVar173 + fVar173)) * 6.0));
                auVar74 = vshufps_avx(auVar81,auVar81,0);
                auVar110 = vshufps_avx(ZEXT416((uint)(fVar173 * 6.0)),ZEXT416((uint)(fVar173 * 6.0))
                                       ,0);
                auVar81 = vdpps_avx(auVar236,auVar236,0x7f);
                auVar114._0_4_ =
                     auVar110._0_4_ * (float)local_b00._0_4_ +
                     auVar74._0_4_ * (float)local_b20._0_4_ +
                     auVar75._0_4_ * (float)local_b30._0_4_ +
                     auVar111._0_4_ * (float)local_b10._0_4_;
                auVar114._4_4_ =
                     auVar110._4_4_ * (float)local_b00._4_4_ +
                     auVar74._4_4_ * (float)local_b20._4_4_ +
                     auVar75._4_4_ * (float)local_b30._4_4_ +
                     auVar111._4_4_ * (float)local_b10._4_4_;
                auVar114._8_4_ =
                     auVar110._8_4_ * fStack_af8 +
                     auVar74._8_4_ * fStack_b18 +
                     auVar75._8_4_ * fStack_b28 + auVar111._8_4_ * fStack_b08;
                auVar114._12_4_ =
                     auVar110._12_4_ * fStack_af4 +
                     auVar74._12_4_ * fStack_b14 +
                     auVar75._12_4_ * fStack_b24 + auVar111._12_4_ * fStack_b04;
                auVar75 = vblendps_avx(auVar81,_DAT_01f7aa10,0xe);
                auVar111 = vrsqrtss_avx(auVar75,auVar75);
                fVar224 = auVar111._0_4_;
                fVar172 = auVar81._0_4_;
                auVar111 = vdpps_avx(auVar236,auVar114,0x7f);
                auVar74 = vshufps_avx(auVar81,auVar81,0);
                auVar115._0_4_ = auVar114._0_4_ * auVar74._0_4_;
                auVar115._4_4_ = auVar114._4_4_ * auVar74._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar74._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar74._12_4_;
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar183._0_4_ = auVar236._0_4_ * auVar111._0_4_;
                auVar183._4_4_ = auVar236._4_4_ * auVar111._4_4_;
                auVar183._8_4_ = auVar236._8_4_ * auVar111._8_4_;
                auVar183._12_4_ = auVar236._12_4_ * auVar111._12_4_;
                auVar110 = vsubps_avx(auVar115,auVar183);
                auVar111 = vrcpss_avx(auVar75,auVar75);
                auVar75 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                     ZEXT416((uint)(auVar208._0_4_ * (float)local_740._0_4_)));
                auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar172 * auVar111._0_4_)));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                uVar66 = CONCAT44(auVar236._4_4_,auVar236._0_4_);
                auVar288._0_8_ = uVar66 ^ 0x8000000080000000;
                auVar288._8_4_ = -auVar236._8_4_;
                auVar288._12_4_ = -auVar236._12_4_;
                auVar74 = ZEXT416((uint)(fVar224 * 1.5 +
                                        fVar172 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar74 = vshufps_avx(auVar74,auVar74,0);
                auVar157._0_4_ = auVar74._0_4_ * auVar110._0_4_ * auVar111._0_4_;
                auVar157._4_4_ = auVar74._4_4_ * auVar110._4_4_ * auVar111._4_4_;
                auVar157._8_4_ = auVar74._8_4_ * auVar110._8_4_ * auVar111._8_4_;
                auVar157._12_4_ = auVar74._12_4_ * auVar110._12_4_ * auVar111._12_4_;
                local_960._0_4_ = auVar236._0_4_ * auVar74._0_4_;
                local_960._4_4_ = auVar236._4_4_ * auVar74._4_4_;
                local_960._8_4_ = auVar236._8_4_ * auVar74._8_4_;
                local_960._12_4_ = auVar236._12_4_ * auVar74._12_4_;
                if (fVar172 < 0.0) {
                  local_980._0_16_ = auVar157;
                  fVar172 = sqrtf(fVar172);
                  auVar157 = local_980._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar172 = auVar81._0_4_;
                }
                auVar81 = vdpps_avx(_local_9c0,local_960._0_16_,0x7f);
                fVar222 = ((float)local_ac0._0_4_ / fVar172) * (fVar222 + 1.0) +
                          fVar222 * (float)local_ac0._0_4_ + auVar75._0_4_;
                auVar111 = vdpps_avx(auVar288,local_960._0_16_,0x7f);
                auVar74 = vdpps_avx(_local_9c0,auVar157,0x7f);
                auVar110 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar135 = vdpps_avx(_local_9c0,auVar288,0x7f);
                fVar172 = auVar111._0_4_ + auVar74._0_4_;
                fVar224 = auVar81._0_4_;
                auVar79._0_4_ = fVar224 * fVar224;
                auVar79._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar79._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar79._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar74 = vsubps_avx(auVar165,auVar79);
                local_960._0_16_ = ZEXT416((uint)fVar172);
                auVar111 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar173 = auVar135._0_4_ - fVar224 * fVar172;
                fVar224 = auVar111._0_4_ - fVar224 * auVar110._0_4_;
                auVar111 = vrsqrtss_avx(auVar74,auVar74);
                fVar226 = auVar74._0_4_;
                fVar172 = auVar111._0_4_;
                fVar172 = fVar172 * 1.5 + fVar226 * -0.5 * fVar172 * fVar172 * fVar172;
                if (fVar226 < 0.0) {
                  local_980._0_16_ = auVar110;
                  local_920._0_4_ = fVar224;
                  local_760._0_4_ = fVar172;
                  local_9a0 = fVar173;
                  fVar226 = sqrtf(fVar226);
                  fVar172 = (float)local_760._0_4_;
                  fVar173 = local_9a0;
                  fVar224 = (float)local_920._0_4_;
                  auVar110 = local_980._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar74,auVar74);
                  fVar226 = auVar111._0_4_;
                }
                auVar135 = vpermilps_avx(local_8c0._0_16_,0xff);
                auVar134 = vshufps_avx(auVar236,auVar236,0xff);
                fVar173 = fVar173 * fVar172 - auVar134._0_4_;
                auVar184._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
                auVar184._8_4_ = auVar110._8_4_ ^ 0x80000000;
                auVar184._12_4_ = auVar110._12_4_ ^ 0x80000000;
                auVar210._0_4_ = -fVar173;
                auVar210._4_4_ = 0x80000000;
                auVar210._8_4_ = 0x80000000;
                auVar210._12_4_ = 0x80000000;
                auVar111 = vinsertps_avx(auVar210,ZEXT416((uint)(fVar224 * fVar172)),0x1c);
                auVar110 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar224 * fVar172 -
                                                       auVar110._0_4_ * fVar173)));
                auVar111 = vdivps_avx(auVar111,auVar110);
                auVar74 = vinsertps_avx(local_960._0_16_,auVar184,0x10);
                auVar74 = vdivps_avx(auVar74,auVar110);
                auVar110 = vmovsldup_avx(auVar81);
                auVar83 = ZEXT416((uint)(fVar226 - auVar135._0_4_));
                auVar135 = vmovsldup_avx(auVar83);
                auVar137._0_4_ = auVar110._0_4_ * auVar111._0_4_ + auVar135._0_4_ * auVar74._0_4_;
                auVar137._4_4_ = auVar110._4_4_ * auVar111._4_4_ + auVar135._4_4_ * auVar74._4_4_;
                auVar137._8_4_ = auVar110._8_4_ * auVar111._8_4_ + auVar135._8_4_ * auVar74._8_4_;
                auVar137._12_4_ =
                     auVar110._12_4_ * auVar111._12_4_ + auVar135._12_4_ * auVar74._12_4_;
                auVar208 = vsubps_avx(auVar208,auVar137);
                auVar138._8_4_ = 0x7fffffff;
                auVar138._0_8_ = 0x7fffffff7fffffff;
                auVar138._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx(auVar81,auVar138);
                if (auVar81._0_4_ < fVar222) {
                  auVar158._8_4_ = 0x7fffffff;
                  auVar158._0_8_ = 0x7fffffff7fffffff;
                  auVar158._12_4_ = 0x7fffffff;
                  auVar81 = vandps_avx(auVar83,auVar158);
                  if (auVar81._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + fVar222 + auVar75._0_4_) {
                    fVar222 = auVar208._0_4_ + (float)local_8a0._0_4_;
                    auVar245 = ZEXT3264(local_aa0);
                    if ((fVar222 < fVar203) ||
                       (fVar172 = *(float *)(ray + k * 4 + 0x100), fVar172 < fVar222)) break;
                    auVar75 = vmovshdup_avx(auVar208);
                    fVar224 = auVar75._0_4_;
                    if ((fVar224 < 0.0) || (1.0 < fVar224)) break;
                    auVar165 = vrsqrtss_avx(auVar165,auVar165);
                    fVar173 = auVar165._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar165 = ZEXT416((uint)(fVar173 * 1.5 +
                                             fVar152 * -0.5 * fVar173 * fVar173 * fVar173));
                    auVar165 = vshufps_avx(auVar165,auVar165,0);
                    auVar159._0_4_ = auVar165._0_4_ * (float)local_9c0._0_4_;
                    auVar159._4_4_ = auVar165._4_4_ * (float)local_9c0._4_4_;
                    auVar159._8_4_ = auVar165._8_4_ * fStack_9b8;
                    auVar159._12_4_ = auVar165._12_4_ * fStack_9b4;
                    auVar116._0_4_ = auVar236._0_4_ + auVar134._0_4_ * auVar159._0_4_;
                    auVar116._4_4_ = auVar236._4_4_ + auVar134._4_4_ * auVar159._4_4_;
                    auVar116._8_4_ = auVar236._8_4_ + auVar134._8_4_ * auVar159._8_4_;
                    auVar116._12_4_ = auVar236._12_4_ + auVar134._12_4_ * auVar159._12_4_;
                    auVar165 = vshufps_avx(auVar159,auVar159,0xc9);
                    auVar75 = vshufps_avx(auVar236,auVar236,0xc9);
                    auVar160._0_4_ = auVar75._0_4_ * auVar159._0_4_;
                    auVar160._4_4_ = auVar75._4_4_ * auVar159._4_4_;
                    auVar160._8_4_ = auVar75._8_4_ * auVar159._8_4_;
                    auVar160._12_4_ = auVar75._12_4_ * auVar159._12_4_;
                    auVar185._0_4_ = auVar236._0_4_ * auVar165._0_4_;
                    auVar185._4_4_ = auVar236._4_4_ * auVar165._4_4_;
                    auVar185._8_4_ = auVar236._8_4_ * auVar165._8_4_;
                    auVar185._12_4_ = auVar236._12_4_ * auVar165._12_4_;
                    auVar81 = vsubps_avx(auVar185,auVar160);
                    auVar165 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar75 = vshufps_avx(auVar116,auVar116,0xc9);
                    auVar186._0_4_ = auVar75._0_4_ * auVar165._0_4_;
                    auVar186._4_4_ = auVar75._4_4_ * auVar165._4_4_;
                    auVar186._8_4_ = auVar75._8_4_ * auVar165._8_4_;
                    auVar186._12_4_ = auVar75._12_4_ * auVar165._12_4_;
                    auVar165 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar117._0_4_ = auVar116._0_4_ * auVar165._0_4_;
                    auVar117._4_4_ = auVar116._4_4_ * auVar165._4_4_;
                    auVar117._8_4_ = auVar116._8_4_ * auVar165._8_4_;
                    auVar117._12_4_ = auVar116._12_4_ * auVar165._12_4_;
                    auVar165 = vsubps_avx(auVar186,auVar117);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar222;
                      uVar1 = vextractps_avx(auVar165,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar165,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar165._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar224;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_900;
                      *(uint *)(ray + k * 4 + 0x240) = uVar63;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar7 = context->user;
                    auStack_550 = vshufps_avx(auVar208,auVar208,0x55);
                    auStack_5b0 = vshufps_avx(auVar165,auVar165,0x55);
                    auStack_590 = vshufps_avx(auVar165,auVar165,0xaa);
                    auStack_570 = vshufps_avx(auVar165,auVar165,0);
                    local_5c0 = (RTCHitN  [16])auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = auStack_570;
                    local_560 = auStack_550;
                    local_540 = ZEXT832(0) << 0x20;
                    local_520 = local_480._0_8_;
                    uStack_518 = local_480._8_8_;
                    uStack_510 = local_480._16_8_;
                    uStack_508 = local_480._24_8_;
                    local_500 = local_460._0_8_;
                    uStack_4f8 = local_460._8_8_;
                    uStack_4f0 = local_460._16_8_;
                    uStack_4e8 = local_460._24_8_;
                    *(undefined1 (*) [8])(local_9e8 + 8) = local_9e0;
                    *(undefined8 *)(local_9e8 + 10) = uStack_9d8;
                    *(undefined8 *)(local_9e8 + 0xc) = uStack_9d0;
                    *(undefined8 *)(local_9e8 + 0xe) = uStack_9c8;
                    *(undefined1 (*) [8])local_9e8 = local_9e0;
                    *(undefined8 *)(local_9e8 + 2) = uStack_9d8;
                    *(undefined8 *)(local_9e8 + 4) = uStack_9d0;
                    *(undefined8 *)(local_9e8 + 6) = uStack_9c8;
                    local_4e0 = pRVar7->instID[0];
                    uStack_4dc = local_4e0;
                    uStack_4d8 = local_4e0;
                    uStack_4d4 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4cc = local_4e0;
                    uStack_4c8 = local_4e0;
                    uStack_4c4 = local_4e0;
                    local_4c0 = pRVar7->instPrimID[0];
                    uStack_4bc = local_4c0;
                    uStack_4b8 = local_4c0;
                    uStack_4b4 = local_4c0;
                    uStack_4b0 = local_4c0;
                    uStack_4ac = local_4c0;
                    uStack_4a8 = local_4c0;
                    uStack_4a4 = local_4c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar222;
                    local_b60 = *local_9f0;
                    local_b50 = *local_9f8;
                    local_af0.valid = (int *)local_b60;
                    local_af0.geometryUserPtr = pGVar4->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_5c0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->intersectionFilterN)(&local_af0);
                      auVar245 = ZEXT3264(local_aa0);
                    }
                    auVar208 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar165 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar145._16_16_ = auVar165;
                    auVar145._0_16_ = auVar208;
                    auVar85 = _local_9e0 & ~auVar145;
                    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar85 >> 0x7f,0) != '\0') ||
                          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar85 >> 0xbf,0) != '\0') ||
                        (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar85[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_af0);
                        auVar245 = ZEXT3264(local_aa0);
                      }
                      auVar208 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar165 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar93._16_16_ = auVar165;
                      auVar93._0_16_ = auVar208;
                      auVar85 = _local_9e0 & ~auVar93;
                      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar85 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar85 >> 0x7f,0) != '\0') ||
                            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar85 >> 0xbf,0) != '\0') ||
                          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar85[0x1f] < '\0') {
                        auVar94._0_4_ = auVar208._0_4_ ^ local_9e0._0_4_;
                        auVar94._4_4_ = auVar208._4_4_ ^ local_9e0._4_4_;
                        auVar94._8_4_ = auVar208._8_4_ ^ (uint)uStack_9d8;
                        auVar94._12_4_ = auVar208._12_4_ ^ uStack_9d8._4_4_;
                        auVar94._16_4_ = auVar165._0_4_ ^ (uint)uStack_9d0;
                        auVar94._20_4_ = auVar165._4_4_ ^ uStack_9d0._4_4_;
                        auVar94._24_4_ = auVar165._8_4_ ^ (uint)uStack_9c8;
                        auVar94._28_4_ = auVar165._12_4_ ^ uStack_9c8._4_4_;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])local_af0.hit);
                        *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x20));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x40));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x60));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x80));
                        *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x100));
                        *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar85;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar172;
                    break;
                  }
                }
                lVar68 = lVar68 + -1;
                auVar245 = ZEXT3264(local_aa0);
              } while (lVar68 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar91._4_4_ = uVar1;
              auVar91._0_4_ = uVar1;
              auVar91._8_4_ = uVar1;
              auVar91._12_4_ = uVar1;
              auVar91._16_4_ = uVar1;
              auVar91._20_4_ = uVar1;
              auVar91._24_4_ = uVar1;
              auVar91._28_4_ = uVar1;
              auVar213 = vcmpps_avx(_local_7c0,auVar91,2);
              auVar85 = vandps_avx(auVar213,local_620);
              auVar319 = ZEXT3264(auVar85);
              auVar213 = local_620 & auVar213;
              auVar191 = local_800._0_28_;
              local_620 = auVar85;
            } while ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar213 >> 0x7f,0) != '\0') ||
                       (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar213 >> 0xbf,0) != '\0') ||
                     (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar213[0x1f] < '\0');
            auVar319 = ZEXT3264(local_3a0);
          }
          auVar130._0_4_ =
               auVar191._0_4_ * (float)local_860._0_4_ +
               (float)local_820._0_4_ * (float)local_880._0_4_ +
               (float)local_7a0._0_4_ * (float)local_720._0_4_;
          auVar130._4_4_ =
               auVar191._4_4_ * (float)local_860._4_4_ +
               (float)local_820._4_4_ * (float)local_880._4_4_ +
               (float)local_7a0._4_4_ * (float)local_720._4_4_;
          auVar130._8_4_ =
               auVar191._8_4_ * fStack_858 + fStack_818 * fStack_878 + fStack_798 * fStack_718;
          auVar130._12_4_ =
               auVar191._12_4_ * fStack_854 + fStack_814 * fStack_874 + fStack_794 * fStack_714;
          auVar130._16_4_ =
               auVar191._16_4_ * fStack_850 + fStack_810 * fStack_870 + fStack_790 * fStack_710;
          auVar130._20_4_ =
               auVar191._20_4_ * fStack_84c + fStack_80c * fStack_86c + fStack_78c * fStack_70c;
          auVar130._24_4_ =
               auVar191._24_4_ * fStack_848 + fStack_808 * fStack_868 + fStack_788 * fStack_708;
          auVar130._28_4_ = fStack_804 + fStack_804 + auVar319._28_4_;
          auVar146._8_4_ = 0x7fffffff;
          auVar146._0_8_ = 0x7fffffff7fffffff;
          auVar146._12_4_ = 0x7fffffff;
          auVar146._16_4_ = 0x7fffffff;
          auVar146._20_4_ = 0x7fffffff;
          auVar146._24_4_ = 0x7fffffff;
          auVar146._28_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar130,auVar146);
          auVar147._8_4_ = 0x3e99999a;
          auVar147._0_8_ = 0x3e99999a3e99999a;
          auVar147._12_4_ = 0x3e99999a;
          auVar147._16_4_ = 0x3e99999a;
          auVar147._20_4_ = 0x3e99999a;
          auVar147._24_4_ = 0x3e99999a;
          auVar147._28_4_ = 0x3e99999a;
          auVar85 = vcmpps_avx(auVar85,auVar147,1);
          auVar213 = vorps_avx(auVar85,local_6c0);
          auVar148._0_4_ = (float)local_7e0._0_4_ + (float)local_8e0;
          auVar148._4_4_ = (float)local_7e0._4_4_ + local_8e0._4_4_;
          auVar148._8_4_ = fStack_7d8 + (float)uStack_8d8;
          auVar148._12_4_ = fStack_7d4 + uStack_8d8._4_4_;
          auVar148._16_4_ = fStack_7d0 + (float)uStack_8d0;
          auVar148._20_4_ = fStack_7cc + uStack_8d0._4_4_;
          auVar148._24_4_ = fStack_7c8 + (float)uStack_8c8;
          auVar148._28_4_ = fStack_7c4 + uStack_8c8._4_4_;
          auVar85 = vcmpps_avx(auVar148,auVar91,2);
          _local_880 = vandps_avx(auVar85,local_6a0);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar85 = vblendvps_avx(auVar171,auVar149,auVar213);
          auVar208 = vpcmpgtd_avx(auVar85._16_16_,local_700);
          auVar165 = vpshufd_avx(local_6e0._0_16_,0);
          auVar165 = vpcmpgtd_avx(auVar85._0_16_,auVar165);
          auVar150._16_16_ = auVar208;
          auVar150._0_16_ = auVar91._0_16_;
          _local_860 = vblendps_avx(ZEXT1632(auVar165),auVar150,0xf0);
          auVar85 = vandnps_avx(_local_860,_local_880);
          auVar213 = _local_880 & ~_local_860;
          local_640 = auVar85;
          if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar213 >> 0x7f,0) != '\0') ||
                (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar213 >> 0xbf,0) != '\0') ||
              (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar213[0x1f] < '\0') {
            local_7c0._4_4_ = local_8e0._4_4_ + local_3a0._4_4_;
            local_7c0._0_4_ = (float)local_8e0 + local_3a0._0_4_;
            fStack_7b8 = (float)uStack_8d8 + local_3a0._8_4_;
            fStack_7b4 = uStack_8d8._4_4_ + local_3a0._12_4_;
            fStack_7b0 = (float)uStack_8d0 + local_3a0._16_4_;
            fStack_7ac = uStack_8d0._4_4_ + local_3a0._20_4_;
            fStack_7a8 = (float)uStack_8c8 + local_3a0._24_4_;
            fStack_7a4 = uStack_8c8._4_4_ + local_3a0._28_4_;
            _local_a80 = local_3a0;
            do {
              auVar95._8_4_ = 0x7f800000;
              auVar95._0_8_ = 0x7f8000007f800000;
              auVar95._12_4_ = 0x7f800000;
              auVar95._16_4_ = 0x7f800000;
              auVar95._20_4_ = 0x7f800000;
              auVar95._24_4_ = 0x7f800000;
              auVar95._28_4_ = 0x7f800000;
              auVar213 = vblendvps_avx(auVar95,_local_a80,auVar85);
              auVar86 = vshufps_avx(auVar213,auVar213,0xb1);
              auVar86 = vminps_avx(auVar213,auVar86);
              auVar123 = vshufpd_avx(auVar86,auVar86,5);
              auVar86 = vminps_avx(auVar86,auVar123);
              auVar123 = vperm2f128_avx(auVar86,auVar86,1);
              auVar86 = vminps_avx(auVar86,auVar123);
              auVar86 = vcmpps_avx(auVar213,auVar86,0);
              auVar123 = auVar85 & auVar86;
              auVar213 = auVar85;
              if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar123 >> 0x7f,0) != '\0') ||
                    (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar123 >> 0xbf,0) != '\0') ||
                  (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar123[0x1f] < '\0') {
                auVar213 = vandps_avx(auVar86,auVar85);
              }
              uVar64 = vmovmskps_avx(auVar213);
              uVar69 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
              uVar66 = (ulong)uVar69;
              local_640 = auVar85;
              *(undefined4 *)(local_640 + uVar66 * 4) = 0;
              fVar152 = local_1c0[uVar66];
              uVar69 = *(uint *)(local_380 + uVar66 * 4);
              fVar222 = auVar17._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar222 = sqrtf((float)local_940._0_4_);
              }
              auVar165 = vminps_avx(_local_b00,_local_b20);
              auVar208 = vmaxps_avx(_local_b00,_local_b20);
              auVar75 = vminps_avx(_local_b10,_local_b30);
              auVar81 = vminps_avx(auVar165,auVar75);
              auVar165 = vmaxps_avx(_local_b10,_local_b30);
              auVar75 = vmaxps_avx(auVar208,auVar165);
              auVar161._8_4_ = 0x7fffffff;
              auVar161._0_8_ = 0x7fffffff7fffffff;
              auVar161._12_4_ = 0x7fffffff;
              auVar208 = vandps_avx(auVar81,auVar161);
              auVar165 = vandps_avx(auVar75,auVar161);
              auVar208 = vmaxps_avx(auVar208,auVar165);
              auVar165 = vmovshdup_avx(auVar208);
              auVar165 = vmaxss_avx(auVar165,auVar208);
              auVar208 = vshufpd_avx(auVar208,auVar208,1);
              auVar208 = vmaxss_avx(auVar208,auVar165);
              local_ac0._0_4_ = auVar208._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar222 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar75,auVar75,0xff);
              auVar208 = vinsertps_avx(ZEXT416(uVar69),ZEXT416((uint)fVar152),0x10);
              lVar68 = 5;
              do {
                auVar165 = vmovshdup_avx(auVar208);
                fVar177 = auVar165._0_4_;
                fVar173 = 1.0 - fVar177;
                auVar165 = vshufps_avx(auVar208,auVar208,0x55);
                fVar152 = auVar165._0_4_;
                fVar222 = auVar165._4_4_;
                fVar172 = auVar165._8_4_;
                fVar224 = auVar165._12_4_;
                auVar165 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
                fVar226 = auVar165._0_4_;
                fVar174 = auVar165._4_4_;
                fVar231 = auVar165._8_4_;
                fVar246 = auVar165._12_4_;
                fVar250 = (float)local_b10._0_4_ * fVar152 + (float)local_b20._0_4_ * fVar226;
                fVar254 = (float)local_b10._4_4_ * fVar222 + (float)local_b20._4_4_ * fVar174;
                fVar175 = fStack_b08 * fVar172 + fStack_b18 * fVar231;
                fVar176 = fStack_b04 * fVar224 + fStack_b14 * fVar246;
                auVar211._0_4_ =
                     fVar226 * ((float)local_b20._0_4_ * fVar152 + fVar226 * (float)local_b00._0_4_)
                     + fVar152 * fVar250;
                auVar211._4_4_ =
                     fVar174 * ((float)local_b20._4_4_ * fVar222 + fVar174 * (float)local_b00._4_4_)
                     + fVar222 * fVar254;
                auVar211._8_4_ =
                     fVar231 * (fStack_b18 * fVar172 + fVar231 * fStack_af8) + fVar172 * fVar175;
                auVar211._12_4_ =
                     fVar246 * (fStack_b14 * fVar224 + fVar246 * fStack_af4) + fVar224 * fVar176;
                auVar162._0_4_ =
                     fVar226 * fVar250 +
                     fVar152 * (fVar152 * (float)local_b30._0_4_ + (float)local_b10._0_4_ * fVar226)
                ;
                auVar162._4_4_ =
                     fVar174 * fVar254 +
                     fVar222 * (fVar222 * (float)local_b30._4_4_ + (float)local_b10._4_4_ * fVar174)
                ;
                auVar162._8_4_ =
                     fVar231 * fVar175 + fVar172 * (fVar172 * fStack_b28 + fStack_b08 * fVar231);
                auVar162._12_4_ =
                     fVar246 * fVar176 + fVar224 * (fVar224 * fStack_b24 + fStack_b04 * fVar246);
                auVar165 = vshufps_avx(auVar208,auVar208,0);
                auVar118._0_4_ = auVar165._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar118._4_4_ = auVar165._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar118._8_4_ = auVar165._8_4_ * fStack_928 + 0.0;
                auVar118._12_4_ = auVar165._12_4_ * fStack_924 + 0.0;
                auVar80._0_4_ = fVar226 * auVar211._0_4_ + fVar152 * auVar162._0_4_;
                auVar80._4_4_ = fVar174 * auVar211._4_4_ + fVar222 * auVar162._4_4_;
                auVar80._8_4_ = fVar231 * auVar211._8_4_ + fVar172 * auVar162._8_4_;
                auVar80._12_4_ = fVar246 * auVar211._12_4_ + fVar224 * auVar162._12_4_;
                local_8c0._0_16_ = auVar80;
                auVar165 = vsubps_avx(auVar118,auVar80);
                _local_9c0 = auVar165;
                auVar165 = vdpps_avx(auVar165,auVar165,0x7f);
                fVar152 = auVar165._0_4_;
                if (fVar152 < 0.0) {
                  fVar222 = sqrtf(fVar152);
                }
                else {
                  auVar75 = vsqrtss_avx(auVar165,auVar165);
                  fVar222 = auVar75._0_4_;
                }
                auVar75 = vsubps_avx(auVar162,auVar211);
                auVar237._0_4_ = auVar75._0_4_ * 3.0;
                auVar237._4_4_ = auVar75._4_4_ * 3.0;
                auVar237._8_4_ = auVar75._8_4_ * 3.0;
                auVar237._12_4_ = auVar75._12_4_ * 3.0;
                auVar75 = vshufps_avx(ZEXT416((uint)(fVar177 * 6.0)),ZEXT416((uint)(fVar177 * 6.0)),
                                      0);
                auVar81 = ZEXT416((uint)((fVar173 - (fVar177 + fVar177)) * 6.0));
                auVar111 = vshufps_avx(auVar81,auVar81,0);
                auVar81 = ZEXT416((uint)((fVar177 - (fVar173 + fVar173)) * 6.0));
                auVar74 = vshufps_avx(auVar81,auVar81,0);
                auVar110 = vshufps_avx(ZEXT416((uint)(fVar173 * 6.0)),ZEXT416((uint)(fVar173 * 6.0))
                                       ,0);
                auVar81 = vdpps_avx(auVar237,auVar237,0x7f);
                auVar119._0_4_ =
                     auVar110._0_4_ * (float)local_b00._0_4_ +
                     auVar74._0_4_ * (float)local_b20._0_4_ +
                     auVar75._0_4_ * (float)local_b30._0_4_ +
                     auVar111._0_4_ * (float)local_b10._0_4_;
                auVar119._4_4_ =
                     auVar110._4_4_ * (float)local_b00._4_4_ +
                     auVar74._4_4_ * (float)local_b20._4_4_ +
                     auVar75._4_4_ * (float)local_b30._4_4_ +
                     auVar111._4_4_ * (float)local_b10._4_4_;
                auVar119._8_4_ =
                     auVar110._8_4_ * fStack_af8 +
                     auVar74._8_4_ * fStack_b18 +
                     auVar75._8_4_ * fStack_b28 + auVar111._8_4_ * fStack_b08;
                auVar119._12_4_ =
                     auVar110._12_4_ * fStack_af4 +
                     auVar74._12_4_ * fStack_b14 +
                     auVar75._12_4_ * fStack_b24 + auVar111._12_4_ * fStack_b04;
                auVar75 = vblendps_avx(auVar81,_DAT_01f7aa10,0xe);
                auVar111 = vrsqrtss_avx(auVar75,auVar75);
                fVar224 = auVar111._0_4_;
                fVar172 = auVar81._0_4_;
                auVar111 = vdpps_avx(auVar237,auVar119,0x7f);
                auVar74 = vshufps_avx(auVar81,auVar81,0);
                auVar120._0_4_ = auVar119._0_4_ * auVar74._0_4_;
                auVar120._4_4_ = auVar119._4_4_ * auVar74._4_4_;
                auVar120._8_4_ = auVar119._8_4_ * auVar74._8_4_;
                auVar120._12_4_ = auVar119._12_4_ * auVar74._12_4_;
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar187._0_4_ = auVar237._0_4_ * auVar111._0_4_;
                auVar187._4_4_ = auVar237._4_4_ * auVar111._4_4_;
                auVar187._8_4_ = auVar237._8_4_ * auVar111._8_4_;
                auVar187._12_4_ = auVar237._12_4_ * auVar111._12_4_;
                auVar110 = vsubps_avx(auVar120,auVar187);
                auVar111 = vrcpss_avx(auVar75,auVar75);
                auVar75 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                     ZEXT416((uint)(auVar208._0_4_ * (float)local_740._0_4_)));
                auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar172 * auVar111._0_4_)));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                uVar66 = CONCAT44(auVar237._4_4_,auVar237._0_4_);
                auVar289._0_8_ = uVar66 ^ 0x8000000080000000;
                auVar289._8_4_ = -auVar237._8_4_;
                auVar289._12_4_ = -auVar237._12_4_;
                auVar74 = ZEXT416((uint)(fVar224 * 1.5 +
                                        fVar172 * -0.5 * fVar224 * fVar224 * fVar224));
                auVar74 = vshufps_avx(auVar74,auVar74,0);
                auVar163._0_4_ = auVar74._0_4_ * auVar110._0_4_ * auVar111._0_4_;
                auVar163._4_4_ = auVar74._4_4_ * auVar110._4_4_ * auVar111._4_4_;
                auVar163._8_4_ = auVar74._8_4_ * auVar110._8_4_ * auVar111._8_4_;
                auVar163._12_4_ = auVar74._12_4_ * auVar110._12_4_ * auVar111._12_4_;
                local_960._0_4_ = auVar237._0_4_ * auVar74._0_4_;
                local_960._4_4_ = auVar237._4_4_ * auVar74._4_4_;
                local_960._8_4_ = auVar237._8_4_ * auVar74._8_4_;
                local_960._12_4_ = auVar237._12_4_ * auVar74._12_4_;
                if (fVar172 < 0.0) {
                  local_980._0_16_ = auVar163;
                  fVar172 = sqrtf(fVar172);
                  auVar163 = local_980._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar172 = auVar81._0_4_;
                }
                auVar81 = vdpps_avx(_local_9c0,local_960._0_16_,0x7f);
                fVar222 = ((float)local_ac0._0_4_ / fVar172) * (fVar222 + 1.0) +
                          fVar222 * (float)local_ac0._0_4_ + auVar75._0_4_;
                auVar111 = vdpps_avx(auVar289,local_960._0_16_,0x7f);
                auVar74 = vdpps_avx(_local_9c0,auVar163,0x7f);
                auVar110 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar135 = vdpps_avx(_local_9c0,auVar289,0x7f);
                fVar172 = auVar111._0_4_ + auVar74._0_4_;
                fVar224 = auVar81._0_4_;
                auVar82._0_4_ = fVar224 * fVar224;
                auVar82._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar82._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar82._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar74 = vsubps_avx(auVar165,auVar82);
                local_960._0_16_ = ZEXT416((uint)fVar172);
                auVar111 = vdpps_avx(_local_9c0,_local_930,0x7f);
                fVar173 = auVar135._0_4_ - fVar224 * fVar172;
                fVar224 = auVar111._0_4_ - fVar224 * auVar110._0_4_;
                auVar111 = vrsqrtss_avx(auVar74,auVar74);
                fVar226 = auVar74._0_4_;
                fVar172 = auVar111._0_4_;
                fVar172 = fVar172 * 1.5 + fVar226 * -0.5 * fVar172 * fVar172 * fVar172;
                if (fVar226 < 0.0) {
                  local_980._0_16_ = auVar110;
                  local_920._0_4_ = fVar224;
                  local_760._0_4_ = fVar172;
                  local_9a0 = fVar173;
                  fVar226 = sqrtf(fVar226);
                  fVar172 = (float)local_760._0_4_;
                  fVar173 = local_9a0;
                  fVar224 = (float)local_920._0_4_;
                  auVar110 = local_980._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar74,auVar74);
                  fVar226 = auVar111._0_4_;
                }
                auVar135 = vpermilps_avx(local_8c0._0_16_,0xff);
                auVar134 = vshufps_avx(auVar237,auVar237,0xff);
                fVar173 = fVar173 * fVar172 - auVar134._0_4_;
                auVar188._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
                auVar188._8_4_ = auVar110._8_4_ ^ 0x80000000;
                auVar188._12_4_ = auVar110._12_4_ ^ 0x80000000;
                auVar212._0_4_ = -fVar173;
                auVar212._4_4_ = 0x80000000;
                auVar212._8_4_ = 0x80000000;
                auVar212._12_4_ = 0x80000000;
                auVar111 = vinsertps_avx(auVar212,ZEXT416((uint)(fVar224 * fVar172)),0x1c);
                auVar110 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar224 * fVar172 -
                                                       auVar110._0_4_ * fVar173)));
                auVar111 = vdivps_avx(auVar111,auVar110);
                auVar74 = vinsertps_avx(local_960._0_16_,auVar188,0x10);
                auVar74 = vdivps_avx(auVar74,auVar110);
                auVar110 = vmovsldup_avx(auVar81);
                auVar83 = ZEXT416((uint)(fVar226 - auVar135._0_4_));
                auVar135 = vmovsldup_avx(auVar83);
                auVar139._0_4_ = auVar110._0_4_ * auVar111._0_4_ + auVar135._0_4_ * auVar74._0_4_;
                auVar139._4_4_ = auVar110._4_4_ * auVar111._4_4_ + auVar135._4_4_ * auVar74._4_4_;
                auVar139._8_4_ = auVar110._8_4_ * auVar111._8_4_ + auVar135._8_4_ * auVar74._8_4_;
                auVar139._12_4_ =
                     auVar110._12_4_ * auVar111._12_4_ + auVar135._12_4_ * auVar74._12_4_;
                auVar208 = vsubps_avx(auVar208,auVar139);
                auVar140._8_4_ = 0x7fffffff;
                auVar140._0_8_ = 0x7fffffff7fffffff;
                auVar140._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx(auVar81,auVar140);
                if (auVar81._0_4_ < fVar222) {
                  auVar164._8_4_ = 0x7fffffff;
                  auVar164._0_8_ = 0x7fffffff7fffffff;
                  auVar164._12_4_ = 0x7fffffff;
                  auVar81 = vandps_avx(auVar83,auVar164);
                  if (auVar81._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + fVar222 + auVar75._0_4_) {
                    fVar222 = auVar208._0_4_ + (float)local_8a0._0_4_;
                    auVar245 = ZEXT3264(local_aa0);
                    if ((fVar222 < fVar203) ||
                       (fVar172 = *(float *)(ray + k * 4 + 0x100), fVar172 < fVar222)) break;
                    auVar75 = vmovshdup_avx(auVar208);
                    fVar224 = auVar75._0_4_;
                    if ((fVar224 < 0.0) || (1.0 < fVar224)) break;
                    auVar165 = vrsqrtss_avx(auVar165,auVar165);
                    fVar173 = auVar165._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar165 = ZEXT416((uint)(fVar173 * 1.5 +
                                             fVar152 * -0.5 * fVar173 * fVar173 * fVar173));
                    auVar165 = vshufps_avx(auVar165,auVar165,0);
                    auVar166._0_4_ = auVar165._0_4_ * (float)local_9c0._0_4_;
                    auVar166._4_4_ = auVar165._4_4_ * (float)local_9c0._4_4_;
                    auVar166._8_4_ = auVar165._8_4_ * fStack_9b8;
                    auVar166._12_4_ = auVar165._12_4_ * fStack_9b4;
                    auVar121._0_4_ = auVar237._0_4_ + auVar134._0_4_ * auVar166._0_4_;
                    auVar121._4_4_ = auVar237._4_4_ + auVar134._4_4_ * auVar166._4_4_;
                    auVar121._8_4_ = auVar237._8_4_ + auVar134._8_4_ * auVar166._8_4_;
                    auVar121._12_4_ = auVar237._12_4_ + auVar134._12_4_ * auVar166._12_4_;
                    auVar165 = vshufps_avx(auVar166,auVar166,0xc9);
                    auVar75 = vshufps_avx(auVar237,auVar237,0xc9);
                    auVar167._0_4_ = auVar75._0_4_ * auVar166._0_4_;
                    auVar167._4_4_ = auVar75._4_4_ * auVar166._4_4_;
                    auVar167._8_4_ = auVar75._8_4_ * auVar166._8_4_;
                    auVar167._12_4_ = auVar75._12_4_ * auVar166._12_4_;
                    auVar189._0_4_ = auVar237._0_4_ * auVar165._0_4_;
                    auVar189._4_4_ = auVar237._4_4_ * auVar165._4_4_;
                    auVar189._8_4_ = auVar237._8_4_ * auVar165._8_4_;
                    auVar189._12_4_ = auVar237._12_4_ * auVar165._12_4_;
                    auVar81 = vsubps_avx(auVar189,auVar167);
                    auVar165 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar75 = vshufps_avx(auVar121,auVar121,0xc9);
                    auVar190._0_4_ = auVar75._0_4_ * auVar165._0_4_;
                    auVar190._4_4_ = auVar75._4_4_ * auVar165._4_4_;
                    auVar190._8_4_ = auVar75._8_4_ * auVar165._8_4_;
                    auVar190._12_4_ = auVar75._12_4_ * auVar165._12_4_;
                    auVar165 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar122._0_4_ = auVar121._0_4_ * auVar165._0_4_;
                    auVar122._4_4_ = auVar121._4_4_ * auVar165._4_4_;
                    auVar122._8_4_ = auVar121._8_4_ * auVar165._8_4_;
                    auVar122._12_4_ = auVar121._12_4_ * auVar165._12_4_;
                    auVar165 = vsubps_avx(auVar190,auVar122);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar222;
                      uVar1 = vextractps_avx(auVar165,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                      uVar1 = vextractps_avx(auVar165,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar165._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar224;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_900;
                      *(uint *)(ray + k * 4 + 0x240) = uVar63;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar7 = context->user;
                    auStack_550 = vshufps_avx(auVar208,auVar208,0x55);
                    auStack_5b0 = vshufps_avx(auVar165,auVar165,0x55);
                    auStack_590 = vshufps_avx(auVar165,auVar165,0xaa);
                    auStack_570 = vshufps_avx(auVar165,auVar165,0);
                    local_5c0 = (RTCHitN  [16])auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = auStack_570;
                    local_560 = auStack_550;
                    local_540 = ZEXT832(0) << 0x20;
                    local_520 = local_480._0_8_;
                    uStack_518 = local_480._8_8_;
                    uStack_510 = local_480._16_8_;
                    uStack_508 = local_480._24_8_;
                    local_500 = local_460._0_8_;
                    uStack_4f8 = local_460._8_8_;
                    uStack_4f0 = local_460._16_8_;
                    uStack_4e8 = local_460._24_8_;
                    *(undefined1 (*) [8])(local_9e8 + 8) = local_9e0;
                    *(undefined8 *)(local_9e8 + 10) = uStack_9d8;
                    *(undefined8 *)(local_9e8 + 0xc) = uStack_9d0;
                    *(undefined8 *)(local_9e8 + 0xe) = uStack_9c8;
                    *(undefined1 (*) [8])local_9e8 = local_9e0;
                    *(undefined8 *)(local_9e8 + 2) = uStack_9d8;
                    *(undefined8 *)(local_9e8 + 4) = uStack_9d0;
                    *(undefined8 *)(local_9e8 + 6) = uStack_9c8;
                    local_4e0 = pRVar7->instID[0];
                    uStack_4dc = local_4e0;
                    uStack_4d8 = local_4e0;
                    uStack_4d4 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4cc = local_4e0;
                    uStack_4c8 = local_4e0;
                    uStack_4c4 = local_4e0;
                    local_4c0 = pRVar7->instPrimID[0];
                    uStack_4bc = local_4c0;
                    uStack_4b8 = local_4c0;
                    uStack_4b4 = local_4c0;
                    uStack_4b0 = local_4c0;
                    uStack_4ac = local_4c0;
                    uStack_4a8 = local_4c0;
                    uStack_4a4 = local_4c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar222;
                    local_b60 = *local_9f0;
                    local_b50 = *local_9f8;
                    local_af0.valid = (int *)local_b60;
                    local_af0.geometryUserPtr = pGVar4->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_5c0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->intersectionFilterN)(&local_af0);
                      auVar245 = ZEXT3264(local_aa0);
                    }
                    auVar208 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar165 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar151._16_16_ = auVar165;
                    auVar151._0_16_ = auVar208;
                    auVar85 = _local_9e0 & ~auVar151;
                    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar85 >> 0x7f,0) != '\0') ||
                          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar85 >> 0xbf,0) != '\0') ||
                        (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar85[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_af0);
                        auVar245 = ZEXT3264(local_aa0);
                      }
                      auVar208 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar165 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar96._16_16_ = auVar165;
                      auVar96._0_16_ = auVar208;
                      auVar85 = _local_9e0 & ~auVar96;
                      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar85 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar85 >> 0x7f,0) != '\0') ||
                            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar85 >> 0xbf,0) != '\0') ||
                          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar85[0x1f] < '\0') {
                        auVar97._0_4_ = auVar208._0_4_ ^ local_9e0._0_4_;
                        auVar97._4_4_ = auVar208._4_4_ ^ local_9e0._4_4_;
                        auVar97._8_4_ = auVar208._8_4_ ^ (uint)uStack_9d8;
                        auVar97._12_4_ = auVar208._12_4_ ^ uStack_9d8._4_4_;
                        auVar97._16_4_ = auVar165._0_4_ ^ (uint)uStack_9d0;
                        auVar97._20_4_ = auVar165._4_4_ ^ uStack_9d0._4_4_;
                        auVar97._24_4_ = auVar165._8_4_ ^ (uint)uStack_9c8;
                        auVar97._28_4_ = auVar165._12_4_ ^ uStack_9c8._4_4_;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])local_af0.hit);
                        *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x20));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x40));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x60));
                        *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x80));
                        *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar85;
                        auVar85 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                          (local_af0.hit + 0x100));
                        *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar85;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar172;
                    break;
                  }
                }
                lVar68 = lVar68 + -1;
                auVar245 = ZEXT3264(local_aa0);
              } while (lVar68 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar91._4_4_ = uVar1;
              auVar91._0_4_ = uVar1;
              auVar91._8_4_ = uVar1;
              auVar91._12_4_ = uVar1;
              auVar91._16_4_ = uVar1;
              auVar91._20_4_ = uVar1;
              auVar91._24_4_ = uVar1;
              auVar91._28_4_ = uVar1;
              auVar213 = vcmpps_avx(_local_7c0,auVar91,2);
              auVar85 = vandps_avx(auVar213,local_640);
              local_640 = local_640 & auVar213;
            } while ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_640 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_640 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_640 >> 0x7f,0) != '\0') ||
                       (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_640 >> 0xbf,0) != '\0') ||
                     (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_640[0x1f] < '\0');
            local_640 = auVar85;
          }
          auVar346 = ZEXT3264(local_a60);
          auVar330 = ZEXT3264(local_a40);
          auVar319 = ZEXT3264(local_a20);
          auVar365 = ZEXT3264(local_840);
          auVar85 = vandps_avx(local_680,local_660);
          auVar213 = vandps_avx(_local_880,_local_860);
          auVar195._0_4_ = (float)local_8e0 + local_3e0._0_4_;
          auVar195._4_4_ = local_8e0._4_4_ + local_3e0._4_4_;
          auVar195._8_4_ = (float)uStack_8d8 + local_3e0._8_4_;
          auVar195._12_4_ = uStack_8d8._4_4_ + local_3e0._12_4_;
          auVar195._16_4_ = (float)uStack_8d0 + local_3e0._16_4_;
          auVar195._20_4_ = uStack_8d0._4_4_ + local_3e0._20_4_;
          auVar195._24_4_ = (float)uStack_8c8 + local_3e0._24_4_;
          auVar195._28_4_ = uStack_8c8._4_4_ + local_3e0._28_4_;
          auVar86 = vcmpps_avx(auVar195,auVar91,2);
          auVar85 = vandps_avx(auVar86,auVar85);
          auVar196._0_4_ = (float)local_8e0 + local_3a0._0_4_;
          auVar196._4_4_ = local_8e0._4_4_ + local_3a0._4_4_;
          auVar196._8_4_ = (float)uStack_8d8 + local_3a0._8_4_;
          auVar196._12_4_ = uStack_8d8._4_4_ + local_3a0._12_4_;
          auVar196._16_4_ = (float)uStack_8d0 + local_3a0._16_4_;
          auVar196._20_4_ = uStack_8d0._4_4_ + local_3a0._20_4_;
          auVar196._24_4_ = (float)uStack_8c8 + local_3a0._24_4_;
          auVar196._28_4_ = uStack_8c8._4_4_ + local_3a0._28_4_;
          auVar86 = vcmpps_avx(auVar196,auVar91,2);
          auVar213 = vandps_avx(auVar86,auVar213);
          auVar213 = vorps_avx(auVar85,auVar213);
          if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar213 >> 0x7f,0) != '\0') ||
                (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar213 >> 0xbf,0) != '\0') ||
              (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar213[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar70 * 0x60) = auVar213;
            auVar85 = vblendvps_avx(local_3a0,_local_3e0,auVar85);
            *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x60) = auVar85;
            uVar2 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar70 * 0xc] = uVar2;
            aiStack_138[uVar70 * 0x18] = local_ca8 + 1;
            iVar72 = iVar72 + 1;
          }
          goto LAB_00ea98fc;
        }
      }
      auVar346 = ZEXT3264(local_a60);
      auVar330 = ZEXT3264(local_a40);
      auVar319 = ZEXT3264(local_a20);
      auVar245 = ZEXT3264(local_aa0);
      auVar365 = ZEXT3264(local_840);
    }
LAB_00ea98fc:
    auVar213 = local_420;
    if (iVar72 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar88._4_4_ = uVar1;
    auVar88._0_4_ = uVar1;
    auVar88._8_4_ = uVar1;
    auVar88._12_4_ = uVar1;
    auVar88._16_4_ = uVar1;
    auVar88._20_4_ = uVar1;
    auVar88._24_4_ = uVar1;
    auVar88._28_4_ = uVar1;
    uVar69 = -iVar72;
    pauVar65 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar72 - 1) * 0x60);
    while( true ) {
      auVar85 = pauVar65[1];
      auVar125._0_4_ = (float)local_8e0 + auVar85._0_4_;
      auVar125._4_4_ = local_8e0._4_4_ + auVar85._4_4_;
      auVar125._8_4_ = (float)uStack_8d8 + auVar85._8_4_;
      auVar125._12_4_ = uStack_8d8._4_4_ + auVar85._12_4_;
      auVar125._16_4_ = (float)uStack_8d0 + auVar85._16_4_;
      auVar125._20_4_ = uStack_8d0._4_4_ + auVar85._20_4_;
      auVar125._24_4_ = (float)uStack_8c8 + auVar85._24_4_;
      auVar125._28_4_ = uStack_8c8._4_4_ + auVar85._28_4_;
      auVar123 = vcmpps_avx(auVar125,auVar88,2);
      auVar86 = vandps_avx(auVar123,*pauVar65);
      _local_5c0 = auVar86;
      auVar123 = *pauVar65 & auVar123;
      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0x7f,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar123 >> 0xbf,0) != '\0') ||
          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar123[0x1f] < '\0') break;
      pauVar65 = pauVar65 + -3;
      uVar69 = uVar69 + 1;
      if (uVar69 == 0) goto LAB_00eab55d;
    }
    auVar89._8_4_ = 0x7f800000;
    auVar89._0_8_ = 0x7f8000007f800000;
    auVar89._12_4_ = 0x7f800000;
    auVar89._16_4_ = 0x7f800000;
    auVar89._20_4_ = 0x7f800000;
    auVar89._24_4_ = 0x7f800000;
    auVar89._28_4_ = 0x7f800000;
    auVar85 = vblendvps_avx(auVar89,auVar85,auVar86);
    auVar123 = vshufps_avx(auVar85,auVar85,0xb1);
    auVar123 = vminps_avx(auVar85,auVar123);
    auVar142 = vshufpd_avx(auVar123,auVar123,5);
    auVar123 = vminps_avx(auVar123,auVar142);
    auVar142 = vperm2f128_avx(auVar123,auVar123,1);
    auVar123 = vminps_avx(auVar123,auVar142);
    auVar85 = vcmpps_avx(auVar85,auVar123,0);
    auVar123 = auVar86 & auVar85;
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar123 >> 0x7f,0) != '\0') ||
          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar123 >> 0xbf,0) != '\0') ||
        (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar123[0x1f] < '\0') {
      auVar86 = vandps_avx(auVar85,auVar86);
    }
    auVar77._8_8_ = 0;
    auVar77._0_8_ = *(ulong *)pauVar65[2];
    local_ca8 = *(uint *)(pauVar65[2] + 8);
    uVar67 = vmovmskps_avx(auVar86);
    uVar64 = 0;
    if (uVar67 != 0) {
      for (; (uVar67 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
      }
    }
    *(undefined4 *)(local_5c0 + (ulong)uVar64 * 4) = 0;
    *pauVar65 = _local_5c0;
    uVar67 = ~uVar69;
    if ((((((((_local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_5c0 >> 0x7f,0) != '\0') ||
          (_local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_5c0 >> 0xbf,0) != '\0') ||
        (_local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5c0[0x1f] < '\0') {
      uVar67 = -uVar69;
    }
    uVar70 = (ulong)uVar67;
    auVar208 = vshufps_avx(auVar77,auVar77,0);
    auVar165 = vshufps_avx(auVar77,auVar77,0x55);
    auVar165 = vsubps_avx(auVar165,auVar208);
    local_3e0._4_4_ = auVar208._4_4_ + auVar165._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar208._0_4_ + auVar165._0_4_ * 0.0;
    fStack_3d8 = auVar208._8_4_ + auVar165._8_4_ * 0.2857143;
    fStack_3d4 = auVar208._12_4_ + auVar165._12_4_ * 0.42857146;
    fStack_3d0 = auVar208._0_4_ + auVar165._0_4_ * 0.5714286;
    fStack_3cc = auVar208._4_4_ + auVar165._4_4_ * 0.71428573;
    fStack_3c8 = auVar208._8_4_ + auVar165._8_4_ * 0.8571429;
    fStack_3c4 = auVar208._12_4_ + auVar165._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar64 * 4);
  } while( true );
LAB_00eab55d:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar84._4_4_ = uVar1;
  auVar84._0_4_ = uVar1;
  auVar84._8_4_ = uVar1;
  auVar84._12_4_ = uVar1;
  auVar112 = vcmpps_avx(local_5e0,auVar84,2);
  uVar63 = vmovmskps_avx(auVar112);
  uVar63 = (uint)uVar71 & uVar63;
  if (uVar63 == 0) {
    return;
  }
  goto LAB_00ea8798;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }